

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O3

void test<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>>>
               (IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>
                *source)

{
  _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  *this;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>
  *pWVar7;
  byte bVar8;
  char cVar9;
  bool bVar10;
  undefined1 uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  size_t sVar15;
  out_of_range *poVar16;
  _Atomic_word _Var17;
  vector<int,_std::allocator<int>_> *source_00;
  vector<int,_std::allocator<int>_> *source_01;
  vector<int,_std::allocator<int>_> *source_02;
  vector<int,_std::allocator<int>_> *source_03;
  vector<int,_std::allocator<int>_> *source_04;
  unsigned_long uVar18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var19;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  iterator __end0;
  iterator __begin0;
  undefined1 local_3c8 [8];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3a0;
  undefined1 local_398 [16];
  undefined1 local_388 [24];
  iterator local_370;
  iterator iStack_368;
  undefined1 local_360 [8];
  undefined8 local_358;
  _Base_ptr local_350;
  iterator local_348;
  _Base_ptr local_340;
  size_t local_338;
  byte local_330;
  WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>
  *local_328;
  allocator_type local_319;
  IEnumerable<int_&> local_318;
  vector<int,_std::allocator<int>_> local_300;
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2c0;
  _Base_ptr p_Stack_2b8;
  undefined1 local_2b0 [24];
  _Base_ptr local_298;
  byte local_290;
  byte local_288;
  byte local_280;
  undefined1 local_270 [16];
  IState<int> local_260;
  vector<int,_std::allocator<int>_> local_258;
  undefined1 local_240 [16];
  undefined1 local_230 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_218;
  _Base_ptr p_Stack_210;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_208;
  undefined1 local_1d8 [8];
  IState<int> IStack_1d0;
  IState<int> local_1c8;
  undefined1 local_1c0 [24];
  undefined1 local_1a8 [16];
  undefined1 local_198 [24];
  iterator local_180;
  iterator iStack_178;
  undefined1 local_170 [32];
  bool local_150;
  bool local_148;
  bool local_140;
  undefined1 local_138 [8];
  IState<int> IStack_130;
  IState<int> local_128;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_120;
  iterator local_118;
  bool local_110;
  undefined7 uStack_10f;
  undefined1 local_108 [8];
  undefined **local_100;
  IState<int> local_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  iterator local_e0;
  iterator local_d8;
  undefined1 local_d0 [24];
  iterator local_b8;
  bool local_b0;
  bool local_a8;
  bool local_a0;
  vector<int,_std::allocator<int>_> local_90;
  IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> local_78;
  int local_48 [6];
  
  linq::
  WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>
  ::Init(&source->source);
  iVar12 = (*((source->source).source.state.
              super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             _vptr_IState[1])();
  if ((char)iVar12 == '\0') {
    poVar16 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(poVar16,"this");
LAB_0010c880:
    __cxa_throw(poVar16,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  iVar13 = (*((source->source).source.state.
              super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             _vptr_IState[3])();
  linq::
  WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>
  ::Advance(&source->source);
  local_328 = &source->source;
  iVar12 = (*((source->source).source.state.
              super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             _vptr_IState[1])();
  pWVar7 = local_328;
  cVar9 = (char)iVar12;
  iVar12 = iVar13;
  while (cVar9 != '\0') {
    iVar14 = (*((pWVar7->source).state.
                super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               _vptr_IState[3])();
    if (iVar14 < iVar13) {
      iVar13 = iVar14;
      iVar12 = iVar14;
    }
    linq::
    WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>
    ::Advance(pWVar7);
    iVar14 = (*((pWVar7->source).state.
                super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               _vptr_IState[1])();
    cVar9 = (char)iVar14;
  }
  assertEquals<int,int>(3,iVar12);
  linq::
  WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>
  ::Init(pWVar7);
  iVar12 = (*((pWVar7->source).state.
              super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             _vptr_IState[1])();
  if ((char)iVar12 == '\0') {
    poVar16 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(poVar16,"this");
    goto LAB_0010c880;
  }
  iVar13 = (*((pWVar7->source).state.
              super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             _vptr_IState[3])();
  linq::
  WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>
  ::Advance(pWVar7);
  iVar12 = (*((pWVar7->source).state.
              super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             _vptr_IState[1])();
  pWVar7 = local_328;
  cVar9 = (char)iVar12;
  iVar12 = iVar13;
  while (cVar9 != '\0') {
    iVar14 = (*((pWVar7->source).state.
                super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               _vptr_IState[3])();
    if (iVar13 < iVar14) {
      iVar13 = iVar14;
      iVar12 = iVar14;
    }
    linq::
    WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>
    ::Advance(pWVar7);
    iVar14 = (*((pWVar7->source).state.
                super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               _vptr_IState[1])();
    cVar9 = (char)iVar14;
  }
  assertEquals<int,int>(10,iVar12);
  linq::
  IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>
  ::begin((iterator *)local_3c8,
          (IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>
           *)(pWVar7->source).state.
             super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  linq::
  IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>
  ::end((iterator *)local_138,
        (IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>
         *)(pWVar7->source).state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr);
  uVar18 = 0;
  while( true ) {
    local_1d8 = (undefined1  [8])&PTR_Init_00156c18;
    IStack_1d0._vptr_IState = (_func_int **)&PTR_Init_00156bc0;
    local_1c8._vptr_IState = local_128._vptr_IState;
    local_1c0._0_8_ = local_120._M_pi;
    if (local_120._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      _Var19._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      _Var19._M_pi = local_120._M_pi;
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_120._M_pi)->_M_use_count = (local_120._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_120._M_pi)->_M_use_count = (local_120._M_pi)->_M_use_count + 1;
      }
    }
    local_1c0[0x10] = local_110;
    bVar10 = linq::
             IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>
             ::iterator::operator!=((iterator *)local_3c8,(iterator *)local_1d8);
    local_1d8 = (undefined1  [8])&PTR_Init_00156c18;
    IStack_1d0._vptr_IState = (_func_int **)&PTR_Init_00156bc0;
    if (_Var19._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var19._M_pi);
    }
    uVar4 = local_3c0._8_8_;
    if (!bVar10) break;
    (*(*(_func_int ***)local_3c0._8_8_)[3])(local_3c0._8_8_);
    linq::
    WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>
    ::Advance((WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>
               *)local_3c8);
    uVar18 = uVar18 + 1;
    iVar12 = (*(*(_func_int ***)uVar4)[1])(uVar4);
    local_3a0._M_pi._0_1_ = SUB41(iVar12,0);
  }
  if (local_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._0_8_);
  }
  assertEquals<int,unsigned_long>(8,uVar18);
  pWVar7 = local_328;
  linq::
  WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>
  ::Init(local_328);
  iVar12 = (*((pWVar7->source).state.
              super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             _vptr_IState[1])();
  if ((char)iVar12 == '\0') {
    poVar16 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(poVar16,"this");
    goto LAB_0010c880;
  }
  iVar12 = (*((pWVar7->source).state.
              super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             _vptr_IState[3])();
  linq::
  WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>
  ::Advance(pWVar7);
  iVar13 = (*((pWVar7->source).state.
              super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             _vptr_IState[1])();
  pWVar7 = local_328;
  cVar9 = (char)iVar13;
  while (cVar9 != '\0') {
    iVar13 = (*((pWVar7->source).state.
                super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               _vptr_IState[3])();
    iVar12 = iVar12 + iVar13;
    linq::
    WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>
    ::Advance(pWVar7);
    iVar13 = (*((pWVar7->source).state.
                super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               _vptr_IState[1])();
    cVar9 = (char)iVar13;
  }
  assertEquals<int,int>(0x34,iVar12);
  linq::
  IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>
  ::Take((IEnumerableCore<linq::TakeState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_int>_>
          *)local_3c8,
         (IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>
          *)(pWVar7->source).state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr,
         (size_t)(pWVar7->source).state.
                 super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        );
  local_398._0_8_ = (void *)0x0;
  linq::
  WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>
  ::Init((WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>
          *)local_3c0);
  uVar6 = local_398._8_8_;
  uVar4 = local_3b0._0_8_;
  if (((_func_void *)local_398._8_8_ == (_func_void *)0x0) ||
     (iVar12 = (*(*(_func_int ***)local_3b0._0_8_)[1])(local_3b0._0_8_), (char)iVar12 == '\0')) {
    poVar16 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(poVar16,"this");
    __cxa_throw(poVar16,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  iVar12 = (*(*(_func_int ***)uVar4)[3])(uVar4);
  linq::
  WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>
  ::Advance((WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>
             *)local_3c0);
  local_398._0_8_ = 1;
  iVar13 = iVar12;
  if ((_func_void *)uVar6 != (_func_void *)0x1) {
    do {
      uVar5 = local_398._0_8_;
      iVar14 = (*(*(_func_int ***)uVar4)[1])(uVar4);
      if ((char)iVar14 == '\0') break;
      iVar14 = (*(*(_func_int ***)uVar4)[3])(uVar4);
      linq::
      WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>
      ::Advance((WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>
                 *)local_3c0);
      if (iVar14 < iVar12) {
        iVar13 = iVar14;
        iVar12 = iVar14;
      }
      local_398._0_8_ = uVar5 + 1;
    } while ((ulong)local_398._0_8_ < (ulong)uVar6);
  }
  assertEquals<int,int>(3,iVar13);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_);
  }
  linq::
  IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>
  ::Take((IEnumerableCore<linq::TakeState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_int>_>
          *)local_3c8,
         (IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>
          *)(local_328->source).state.
            super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
         (size_t)(local_328->source).state.
                 super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        );
  local_398._0_8_ = (void *)0x0;
  linq::
  WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>
  ::Init((WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>
          *)local_3c0);
  uVar6 = local_398._8_8_;
  uVar4 = local_3b0._0_8_;
  if (((_func_void *)local_398._8_8_ == (_func_void *)0x0) ||
     (iVar12 = (*(*(_func_int ***)local_3b0._0_8_)[1])(local_3b0._0_8_), (char)iVar12 == '\0')) {
    poVar16 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(poVar16,"this");
    __cxa_throw(poVar16,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  iVar12 = (*(*(_func_int ***)uVar4)[3])(uVar4);
  linq::
  WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>
  ::Advance((WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>
             *)local_3c0);
  local_398._0_8_ = (_func_void *)0x1;
  iVar13 = iVar12;
  if ((_func_void *)uVar6 != (_func_void *)0x1) {
    do {
      uVar5 = local_398._0_8_;
      iVar14 = (*(*(_func_int ***)uVar4)[1])(uVar4);
      if ((char)iVar14 == '\0') break;
      iVar14 = (*(*(_func_int ***)uVar4)[3])(uVar4);
      linq::
      WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>
      ::Advance((WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>
                 *)local_3c0);
      if (iVar12 < iVar14) {
        iVar13 = iVar14;
        iVar12 = iVar14;
      }
      local_398._0_8_ = uVar5 + 1;
    } while ((ulong)local_398._0_8_ < (ulong)uVar6);
  }
  assertEquals<int,int>(5,iVar13);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_);
  }
  linq::
  IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>
  ::Skip((IEnumerableCore<linq::SkipState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_int>_>
          *)local_3c8,
         (IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>
          *)(local_328->source).state.
            super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
         (size_t)(local_328->source).state.
                 super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        );
  linq::
  SkipState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_int>
  ::Init((SkipState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_int>
          *)local_3c8);
  uVar4 = local_3b0._0_8_;
  iVar12 = (*(*(_func_int ***)local_3b0._0_8_)[1])(local_3b0._0_8_);
  if ((char)iVar12 == '\0') {
    poVar16 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(poVar16,"this");
    __cxa_throw(poVar16,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  iVar13 = (*(*(_func_int ***)uVar4)[3])(uVar4);
  linq::
  WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>
  ::Advance((WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>
             *)local_3c0);
  iVar12 = (*(*(_func_int ***)uVar4)[1])(uVar4);
  cVar9 = (char)iVar12;
  iVar12 = iVar13;
  while (cVar9 != '\0') {
    iVar14 = (*(*(_func_int ***)uVar4)[3])(uVar4);
    linq::
    WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>
    ::Advance((WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>
               *)local_3c0);
    if (iVar14 < iVar12) {
      iVar13 = iVar14;
      iVar12 = iVar14;
    }
    iVar14 = (*(*(_func_int ***)uVar4)[1])(uVar4);
    cVar9 = (char)iVar14;
  }
  assertEquals<int,int>(6,iVar13);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_);
  }
  linq::
  IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>
  ::Skip((IEnumerableCore<linq::SkipState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_int>_>
          *)local_3c8,
         (IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>
          *)(local_328->source).state.
            super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
         (size_t)(local_328->source).state.
                 super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        );
  linq::
  SkipState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_int>
  ::Init((SkipState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_int>
          *)local_3c8);
  iVar12 = (*(*(_func_int ***)local_3b0._0_8_)[1])(local_3b0._0_8_);
  if ((char)iVar12 == '\0') {
    poVar16 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(poVar16,"this");
    __cxa_throw(poVar16,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  iVar13 = (*(*(_func_int ***)local_3b0._0_8_)[3])(local_3b0._0_8_);
  linq::
  WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>
  ::Advance((WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>
             *)local_3c0);
  iVar12 = (*(*(_func_int ***)local_3b0._0_8_)[1])(local_3b0._0_8_);
  cVar9 = (char)iVar12;
  iVar12 = iVar13;
  while (cVar9 != '\0') {
    iVar14 = (*(*(_func_int ***)local_3b0._0_8_)[3])(local_3b0._0_8_);
    linq::
    WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>
    ::Advance((WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>
               *)local_3c0);
    if (iVar12 < iVar14) {
      iVar13 = iVar14;
      iVar12 = iVar14;
    }
    iVar14 = (*(*(_func_int ***)local_3b0._0_8_)[1])(local_3b0._0_8_);
    cVar9 = (char)iVar14;
  }
  assertEquals<int,int>(10,iVar13);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_);
  }
  local_3b0._0_8_ =
       (local_328->source).state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_3b0._8_8_ =
       (local_328->source).state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_ ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_3c8 = (undefined1  [8])&PTR_Init_00156cf0;
    local_3c0._0_8_ = &PTR_Init_00156c18;
    local_3c0._8_8_ = &PTR_Init_00156bc0;
    local_3b0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_)->_M_use_count + 1;
      UNLOCK();
      if (__libc_single_threaded != '\0') {
        _Var17 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_)->_M_use_count;
        goto LAB_00108022;
      }
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      _Var17 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_)->_M_use_count + 1;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_)->_M_use_count = _Var17;
LAB_00108022:
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_)->_M_use_count = _Var17 + 1;
    }
    local_3c0._8_8_ = &PTR_Init_00156bc0;
    local_3c0._0_8_ = &PTR_Init_00156c18;
    local_3c8 = (undefined1  [8])&PTR_Init_00156cf0;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_);
  }
  linq::
  WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>
  ::Init((WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>
          *)local_3c0);
  bVar10 = linq::
           TakeWhileState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:17:39),_int>
           ::Valid((TakeWhileState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:17:39),_int>
                    *)local_3c8);
  uVar4 = local_3b0._0_8_;
  if (!bVar10) {
    poVar16 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(poVar16,"this");
    __cxa_throw(poVar16,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  iVar12 = (*(*(_func_int ***)local_3b0._0_8_)[3])(local_3b0._0_8_);
  linq::
  WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>
  ::Advance((WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>
             *)local_3c0);
  bVar10 = linq::
           TakeWhileState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:17:39),_int>
           ::Valid((TakeWhileState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:17:39),_int>
                    *)local_3c8);
  iVar13 = iVar12;
  if (bVar10) {
    do {
      iVar14 = (*(*(_func_int ***)uVar4)[3])(uVar4);
      linq::
      WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>
      ::Advance((WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>
                 *)local_3c0);
      if (iVar14 < iVar12) {
        iVar13 = iVar14;
        iVar12 = iVar14;
      }
      bVar10 = linq::
               TakeWhileState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:17:39),_int>
               ::Valid((TakeWhileState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:17:39),_int>
                        *)local_3c8);
    } while (bVar10);
  }
  assertEquals<int,int>(3,iVar13);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_);
  }
  local_3b0._0_8_ =
       (local_328->source).state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_3b0._8_8_ =
       (local_328->source).state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_ ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_3c8 = (undefined1  [8])&PTR_Init_00156d38;
    local_3c0._0_8_ = &PTR_Init_00156c18;
    local_3c0._8_8_ = &PTR_Init_00156bc0;
    local_3b0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_)->_M_use_count + 1;
      UNLOCK();
      if (__libc_single_threaded != '\0') {
        _Var17 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_)->_M_use_count;
        goto LAB_00108187;
      }
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      _Var17 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_)->_M_use_count + 1;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_)->_M_use_count = _Var17;
LAB_00108187:
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_)->_M_use_count = _Var17 + 1;
    }
    local_3c0._8_8_ = &PTR_Init_00156bc0;
    local_3c0._0_8_ = &PTR_Init_00156c18;
    local_3c8 = (undefined1  [8])&PTR_Init_00156d38;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_);
  }
  linq::
  WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>
  ::Init((WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>
          *)local_3c0);
  bVar10 = linq::
           TakeWhileState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:18:39),_int>
           ::Valid((TakeWhileState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:18:39),_int>
                    *)local_3c8);
  uVar4 = local_3b0._0_8_;
  if (!bVar10) {
    poVar16 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(poVar16,"this");
    __cxa_throw(poVar16,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  iVar12 = (*(*(_func_int ***)local_3b0._0_8_)[3])(local_3b0._0_8_);
  linq::
  WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>
  ::Advance((WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>
             *)local_3c0);
  bVar10 = linq::
           TakeWhileState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:18:39),_int>
           ::Valid((TakeWhileState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:18:39),_int>
                    *)local_3c8);
  iVar13 = iVar12;
  if (bVar10) {
    do {
      iVar14 = (*(*(_func_int ***)uVar4)[3])(uVar4);
      linq::
      WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>
      ::Advance((WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>
                 *)local_3c0);
      if (iVar12 < iVar14) {
        iVar13 = iVar14;
        iVar12 = iVar14;
      }
      bVar10 = linq::
               TakeWhileState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:18:39),_int>
               ::Valid((TakeWhileState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:18:39),_int>
                        *)local_3c8);
    } while (bVar10);
  }
  assertEquals<int,int>(4,iVar13);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_);
  }
  local_3b0._0_8_ =
       (local_328->source).state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_3b0._8_8_ =
       (local_328->source).state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_ ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_3c8 = (undefined1  [8])&PTR_Init_00156d80;
    local_3c0._0_8_ = &PTR_Init_00156c18;
    local_3c0._8_8_ = &PTR_Init_00156bc0;
    local_3b0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_)->_M_use_count + 1;
      UNLOCK();
      if (__libc_single_threaded != '\0') {
        _Var17 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_)->_M_use_count;
        goto LAB_001082e5;
      }
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      _Var17 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_)->_M_use_count + 1;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_)->_M_use_count = _Var17;
LAB_001082e5:
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_)->_M_use_count = _Var17 + 1;
    }
    local_3c0._8_8_ = &PTR_Init_00156bc0;
    local_3c0._0_8_ = &PTR_Init_00156c18;
    local_3c8 = (undefined1  [8])&PTR_Init_00156d80;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_);
  }
  linq::
  SkipWhileState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:19:39),_int>
  ::Init((SkipWhileState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:19:39),_int>
          *)local_3c8);
  uVar4 = local_3b0._0_8_;
  iVar12 = (*(*(_func_int ***)local_3b0._0_8_)[1])(local_3b0._0_8_);
  if ((char)iVar12 == '\0') {
    poVar16 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(poVar16,"this");
    __cxa_throw(poVar16,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  iVar13 = (*(*(_func_int ***)uVar4)[3])(uVar4);
  linq::
  WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>
  ::Advance((WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>
             *)local_3c0);
  iVar12 = (*(*(_func_int ***)uVar4)[1])(uVar4);
  cVar9 = (char)iVar12;
  iVar12 = iVar13;
  while (cVar9 != '\0') {
    iVar14 = (*(*(_func_int ***)uVar4)[3])(uVar4);
    linq::
    WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>
    ::Advance((WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>
               *)local_3c0);
    if (iVar14 < iVar12) {
      iVar13 = iVar14;
      iVar12 = iVar14;
    }
    iVar14 = (*(*(_func_int ***)uVar4)[1])(uVar4);
    cVar9 = (char)iVar14;
  }
  assertEquals<int,int>(5,iVar13);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_);
  }
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (local_328->source).state.
           super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (local_328->source).state.
           super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_3b0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
      if (__libc_single_threaded != '\0') {
        _Var17 = p_Var3->_M_use_count;
        goto LAB_001083f7;
      }
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      _Var17 = p_Var3->_M_use_count + 1;
      p_Var3->_M_use_count = _Var17;
LAB_001083f7:
      p_Var3->_M_use_count = _Var17 + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    local_3b0._8_8_ = p_Var3;
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
        goto LAB_0010848f;
      }
      _Var17 = p_Var3->_M_use_count;
    }
    else {
      _Var17 = p_Var3->_M_use_count + 1;
      p_Var3->_M_use_count = _Var17;
    }
    p_Var3->_M_use_count = _Var17 + 1;
  }
LAB_0010848f:
  local_3c0._8_8_ = &PTR_Init_00156bc0;
  local_3c0._0_8_ = &PTR_Init_00156c18;
  local_3c8 = (undefined1  [8])&PTR_Init_00156dc8;
  local_398[8] = '\x01';
  local_3b0._0_8_ = p_Var2;
  linq::
  WhereState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:20:35),_int>
  ::Init((WhereState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:20:35),_int>
          *)local_3c8);
  iVar12 = (*(*(_func_int ***)local_3b0._0_8_)[1])();
  local_398[8] = (char)iVar12;
  if (p_Var3 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_001084ef;
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  if (__libc_single_threaded == '\0') {
    LOCK();
    p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    UNLOCK();
    if (__libc_single_threaded != '\0') {
      _Var17 = p_Var3->_M_use_count;
      goto LAB_001084e1;
    }
    LOCK();
    p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    UNLOCK();
  }
  else {
    _Var17 = p_Var3->_M_use_count + 1;
    p_Var3->_M_use_count = _Var17;
LAB_001084e1:
    p_Var3->_M_use_count = _Var17 + 1;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
LAB_001084ef:
  uVar18 = 0;
  do {
    uVar11 = local_398[8];
    if (p_Var3 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (local_398[8] == '\0') goto LAB_00108581;
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
        if (__libc_single_threaded != '\0') {
          _Var17 = p_Var3->_M_use_count;
          goto LAB_00108528;
        }
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        _Var17 = p_Var3->_M_use_count + 1;
        p_Var3->_M_use_count = _Var17;
LAB_00108528:
        p_Var3->_M_use_count = _Var17 + 1;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      if (uVar11 == '\0') break;
    }
    uVar4 = local_3b0._0_8_;
    (*(*(_func_int ***)local_3b0._0_8_)[3])(local_3b0._0_8_);
    linq::
    WhereState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:20:35),_int>
    ::Advance((WhereState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:20:35),_int>
               *)local_3c8);
    uVar18 = uVar18 + 1;
    iVar12 = (*(*(_func_int ***)uVar4)[1])(uVar4);
    local_398[8] = (char)iVar12;
  } while( true );
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
LAB_00108581:
  local_3c0._0_8_ = &PTR_Init_00156c18;
  local_3c0._8_8_ = &PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_);
  }
  assertEquals<int,unsigned_long>(4,uVar18);
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (local_328->source).state.
           super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (local_328->source).state.
           super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_3c8 = (undefined1  [8])&PTR_Init_00156e58;
    local_3c0._0_8_ = &PTR_Init_00156e10;
    local_3c0._8_8_ = &PTR_Init_00156c18;
    local_3b0._0_8_ = &PTR_Init_00156bc0;
    local_3a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_388._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
    local_3b0._8_8_ = p_Var2;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
      if (__libc_single_threaded != '\0') {
        _Var17 = p_Var3->_M_use_count;
        goto LAB_0010864c;
      }
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      _Var17 = p_Var3->_M_use_count + 1;
      p_Var3->_M_use_count = _Var17;
LAB_0010864c:
      p_Var3->_M_use_count = _Var17 + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
      if (__libc_single_threaded != '\0') {
        _Var17 = p_Var3->_M_use_count;
        goto LAB_001086f6;
      }
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      _Var17 = p_Var3->_M_use_count + 1;
      p_Var3->_M_use_count = _Var17;
LAB_001086f6:
      p_Var3->_M_use_count = _Var17 + 1;
    }
    local_3b0._0_8_ = &PTR_Init_00156bc0;
    local_3c0._8_8_ = &PTR_Init_00156c18;
    local_3c0._0_8_ = &PTR_Init_00156e10;
    local_3c8 = (undefined1  [8])&PTR_Init_00156e58;
    local_388._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
    local_3b0._8_8_ = p_Var2;
    local_3a0._M_pi = p_Var3;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  linq::
  SkipState<linq::WhereState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:21:35),_int>,_int>
  ::Init((SkipState<linq::WhereState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:21:35),_int>,_int>
          *)local_3c8);
  uVar4 = local_3b0._8_8_;
  iVar12 = (*(*(_func_int ***)local_3b0._8_8_)[1])(local_3b0._8_8_);
  if ((char)iVar12 == '\0') {
    poVar16 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(poVar16,"this");
    __cxa_throw(poVar16,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  iVar12 = (*(*(_func_int ***)uVar4)[3])(uVar4);
  assertEquals<int,int>(6,iVar12);
  local_3b0._0_8_ = &PTR_Init_00156bc0;
  if (local_3a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3a0._M_pi);
  }
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  local_138 = (undefined1  [8])0x0;
  IStack_130._vptr_IState = (_func_int **)0x0;
  local_120._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       _Function_handler<bool_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:22:37)>
       ::_M_invoke;
  local_128._vptr_IState =
       (_func_int **)
       std::
       _Function_handler<bool_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:22:37)>
       ::_M_manager;
  linq::
  GroupByState<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>,_bool,_int>
  ::GroupByState((GroupByState<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>,_bool,_int>
                  *)local_3c8,
                 (IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>
                  *)(local_328->source).state.
                    super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 (function<bool_(const_int_&)> *)
                 (local_328->source).state.
                 super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                );
  linq::
  IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>,_bool,_int>_>
  ::IEnumerableCore((IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>,_bool,_int>_>
                     *)local_270,
                    (GroupByState<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>,_bool,_int>
                     *)local_3c8);
  local_3c8 = (undefined1  [8])&PTR_Init_00156eb0;
  std::
  _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
               *)(local_388 + 0x10));
  if ((_func_int **)local_388._0_8_ != (_func_int **)0x0) {
    (*(code *)local_388._0_8_)(local_398,local_398,3);
  }
  local_3c0._0_8_ = &PTR_Init_00156c18;
  local_3c0._8_8_ = &PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_);
  }
  if ((element_type *)local_128._vptr_IState != (element_type *)0x0) {
    (*(code *)local_128._vptr_IState)(local_138,local_138,3);
  }
  local_3c8 = (undefined1  [8])&PTR_Init_00156eb0;
  local_3c0._0_8_ = &PTR_Init_00156c18;
  local_3c0._8_8_ = &PTR_Init_00156bc0;
  local_3b0._0_8_ =
       local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_3b0._8_8_ =
       local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)
       ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish + 8) =
           *(_Atomic_word *)
            ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)
       ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish + 8) =
           *(_Atomic_word *)
            ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 8) + 1;
    }
  }
  std::function<bool_(const_int_&)>::function
            ((function<bool_(const_int_&)> *)local_398,(function<bool_(const_int_&)> *)local_240);
  std::
  _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::_Rb_tree((_Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
              *)(local_388 + 0x10),
             (_Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
              *)(local_230 + 0x10));
  local_348._M_node = local_208._M_impl.super__Rb_tree_header._M_header._M_left;
  linq::
  IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>,_bool,_int>_>
  ::iterator::iterator
            ((iterator *)local_138,
             (GroupByState<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>,_bool,_int>
              *)local_3c8,true);
  local_3c8 = (undefined1  [8])&PTR_Init_00156eb0;
  std::
  _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
               *)(local_388 + 0x10));
  if ((_func_int **)local_388._0_8_ != (_func_int **)0x0) {
    (*(code *)local_388._0_8_)
              ((function<bool_(const_int_&)> *)local_398,(function<bool_(const_int_&)> *)local_398,3
              );
  }
  local_3c0._0_8_ = &PTR_Init_00156c18;
  local_3c0._8_8_ = &PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_);
  }
  local_3c8 = (undefined1  [8])&PTR_Init_00156eb0;
  local_3c0._0_8_ = &PTR_Init_00156c18;
  local_3c0._8_8_ = &PTR_Init_00156bc0;
  local_3b0._0_8_ =
       local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_3b0._8_8_ =
       local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)
       ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish + 8) =
           *(_Atomic_word *)
            ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)
       ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish + 8) =
           *(_Atomic_word *)
            ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 8) + 1;
    }
  }
  std::function<bool_(const_int_&)>::function
            ((function<bool_(const_int_&)> *)local_398,(function<bool_(const_int_&)> *)local_240);
  std::
  _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::_Rb_tree((_Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
              *)(local_388 + 0x10),
             (_Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
              *)(local_230 + 0x10));
  local_348._M_node = local_208._M_impl.super__Rb_tree_header._M_header._M_left;
  linq::
  IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>,_bool,_int>_>
  ::iterator::iterator
            ((iterator *)local_1d8,
             (GroupByState<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>,_bool,_int>
              *)local_3c8,false);
  local_3c8 = (undefined1  [8])&PTR_Init_00156eb0;
  std::
  _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
               *)(local_388 + 0x10));
  if ((_func_int **)local_388._0_8_ != (_func_int **)0x0) {
    (*(code *)local_388._0_8_)
              ((function<bool_(const_int_&)> *)local_398,(function<bool_(const_int_&)> *)local_398,3
              );
  }
  local_3c0._0_8_ = &PTR_Init_00156c18;
  local_3c0._8_8_ = &PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_);
  }
  this = (_Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
          *)(local_2d8 + 0x10);
  uVar18 = 0;
  while( true ) {
    local_318.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_00156eb0;
    local_318.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&PTR_Init_00156c18;
    local_318.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR_Init_00156bc0;
    local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)local_1c0._0_8_;
    local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)local_1c0._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_1c0._8_8_ + 8) = *(_Atomic_word *)(local_1c0._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_1c0._8_8_ + 8) = *(_Atomic_word *)(local_1c0._8_8_ + 8) + 1;
      }
    }
    std::function<bool_(const_int_&)>::function
              ((function<bool_(const_int_&)> *)local_2e8,(function<bool_(const_int_&)> *)local_1a8);
    std::
    _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::_Rb_tree(this,(_Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
                     *)(local_198 + 0x10));
    local_298 = (_Base_ptr)CONCAT71(local_170._25_7_,local_170[0x18]);
    local_290 = local_150;
    local_3c8 = (undefined1  [8])&PTR_Init_00156eb0;
    local_3c0._0_8_ = &PTR_Init_00156c18;
    local_3c0._8_8_ = &PTR_Init_00156bc0;
    local_3b0._0_8_ =
         local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start;
    local_3b0._8_8_ =
         local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)
         ((long)local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 8) =
             *(_Atomic_word *)
              ((long)local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)
         ((long)local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 8) =
             *(_Atomic_word *)
              ((long)local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 8) + 1;
      }
    }
    std::function<bool_(const_int_&)>::function
              ((function<bool_(const_int_&)> *)local_398,(function<bool_(const_int_&)> *)local_2e8);
    std::
    _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::_Rb_tree((_Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
                *)(local_388 + 0x10),this);
    bVar10 = local_b0;
    bVar8 = local_290;
    local_348._M_node = local_298;
    local_340 = (_Base_ptr)CONCAT71(local_340._1_7_,local_290);
    local_3c8 = (undefined1  [8])&PTR_Init_00156eb0;
    std::
    _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
                 *)(local_388 + 0x10));
    if ((_func_int **)local_388._0_8_ != (_func_int **)0x0) {
      (*(code *)local_388._0_8_)(local_398,local_398,3);
    }
    local_3c0._0_8_ = &PTR_Init_00156c18;
    local_3c0._8_8_ = &PTR_Init_00156bc0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_);
    }
    local_318.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_00156eb0;
    std::
    _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::~_Rb_tree(this);
    if ((undefined **)local_2d8._0_8_ != (undefined **)0x0) {
      (*(code *)local_2d8._0_8_)((_Any_data *)local_2e8,(_Any_data *)local_2e8,__destroy_functor);
    }
    local_318.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&PTR_Init_00156c18;
    local_318.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR_Init_00156bc0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
    if (((bVar10 | bVar8) & 1) == 0) break;
    linq::
    GroupByState<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>,_bool,_int>
    ::Current((OUT *)local_3c8,
              (GroupByState<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>,_bool,_int>
               *)local_138);
    local_3c8 = (undefined1  [8])&PTR_Init_00157638;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3c0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3c0._8_8_);
    }
    local_b8._M_node = (_Base_ptr)std::_Rb_tree_increment(local_b8._M_node);
    local_b0 = local_b8._M_node != (_Rb_tree_node_base *)&local_e0;
    uVar18 = uVar18 + 1;
  }
  local_1d8 = (undefined1  [8])&PTR_Init_00156eb0;
  std::
  _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
               *)(local_198 + 0x10));
  if ((_func_int **)local_198._0_8_ != (_func_int **)0x0) {
    (*(code *)local_198._0_8_)(local_1a8,local_1a8,3);
  }
  IStack_1d0._vptr_IState = (_func_int **)&PTR_Init_00156c18;
  local_1c8._vptr_IState = (_func_int **)&PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_);
  }
  local_138 = (undefined1  [8])&PTR_Init_00156eb0;
  std::
  _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
               *)&local_e8);
  if (local_f8._vptr_IState != (_func_int **)0x0) {
    (*(code *)local_f8._vptr_IState)(local_108,local_108,3);
  }
  IStack_130._vptr_IState = (_func_int **)&PTR_Init_00156c18;
  local_128._vptr_IState = (_func_int **)&PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._M_current !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._M_current);
  }
  assertEquals<int,unsigned_long>(2,uVar18);
  local_270._0_8_ = &PTR_Init_00156eb0;
  std::
  _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
               *)(local_230 + 0x10));
  if ((_func_int **)local_230._0_8_ != (_func_int **)0x0) {
    (*(code *)local_230._0_8_)(local_240,local_240,3);
  }
  local_270._8_8_ = &PTR_Init_00156c18;
  local_260._vptr_IState = (_func_int **)&PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  local_1d8 = (undefined1  [8])0x0;
  IStack_1d0._vptr_IState = (_func_int **)0x0;
  local_1c0._0_8_ =
       std::
       _Function_handler<bool_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:23:37)>
       ::_M_invoke;
  local_1c8._vptr_IState =
       (_func_int **)
       std::
       _Function_handler<bool_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:23:37)>
       ::_M_manager;
  linq::
  GroupByState<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>,_bool,_int>
  ::GroupByState((GroupByState<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>,_bool,_int>
                  *)local_3c8,
                 (IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>
                  *)(local_328->source).state.
                    super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 (function<bool_(const_int_&)> *)
                 (local_328->source).state.
                 super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                );
  linq::
  IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>,_bool,_int>_>
  ::IEnumerableCore((IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>,_bool,_int>_>
                     *)local_138,
                    (GroupByState<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>,_bool,_int>
                     *)local_3c8);
  local_3c8 = (undefined1  [8])&PTR_Init_00156eb0;
  std::
  _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
               *)(local_388 + 0x10));
  if ((_func_int **)local_388._0_8_ != (_func_int **)0x0) {
    (*(code *)local_388._0_8_)(local_398,local_398,3);
  }
  local_3c0._0_8_ = &PTR_Init_00156c18;
  local_3c0._8_8_ = &PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_);
  }
  if ((element_type *)local_1c8._vptr_IState != (element_type *)0x0) {
    (*(code *)local_1c8._vptr_IState)(local_1d8,local_1d8,3);
  }
  (**(_func_int **)local_138)();
  iVar12 = (**(_func_int **)((long)local_138 + 8))();
  if ((char)iVar12 == '\0') {
    poVar16 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(poVar16,"this");
    __cxa_throw(poVar16,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  (**(_func_int **)((long)local_138 + 0x18))(&local_318);
  sVar15 = linq::IEnumerable<int_&>::Count(&local_318);
  assertEquals<int,unsigned_long>(6,sVar15);
  local_318.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_00157638;
  if (local_318.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_318.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_138 = (undefined1  [8])&PTR_Init_00156eb0;
  std::
  _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
               *)&local_e8);
  if (local_f8._vptr_IState != (_func_int **)0x0) {
    (*(code *)local_f8._vptr_IState)(local_108,local_108,3);
  }
  IStack_130._vptr_IState = (_func_int **)&PTR_Init_00156c18;
  local_128._vptr_IState = (_func_int **)&PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._M_current !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._M_current);
  }
  local_1d8 = (undefined1  [8])0x0;
  IStack_1d0._vptr_IState = (_func_int **)0x0;
  local_1c0._0_8_ =
       std::
       _Function_handler<bool_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:24:37)>
       ::_M_invoke;
  local_1c8._vptr_IState =
       (_func_int **)
       std::
       _Function_handler<bool_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:24:37)>
       ::_M_manager;
  linq::
  GroupByState<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>,_bool,_int>
  ::GroupByState((GroupByState<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>,_bool,_int>
                  *)local_3c8,
                 (IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>
                  *)(local_328->source).state.
                    super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 (function<bool_(const_int_&)> *)
                 (local_328->source).state.
                 super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                );
  linq::
  IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>,_bool,_int>_>
  ::IEnumerableCore((IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>,_bool,_int>_>
                     *)local_138,
                    (GroupByState<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>,_bool,_int>
                     *)local_3c8);
  local_3c8 = (undefined1  [8])&PTR_Init_00156eb0;
  std::
  _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
               *)(local_388 + 0x10));
  if ((_func_int **)local_388._0_8_ != (_func_int **)0x0) {
    (*(code *)local_388._0_8_)(local_398,local_398,3);
  }
  local_3c0._0_8_ = &PTR_Init_00156c18;
  local_3c0._8_8_ = &PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_);
  }
  if ((element_type *)local_1c8._vptr_IState != (element_type *)0x0) {
    (*(code *)local_1c8._vptr_IState)(local_1d8,local_1d8,3);
  }
  (**(_func_int **)local_138)();
  iVar12 = (**(_func_int **)((long)local_138 + 8))();
  if ((char)iVar12 == '\0') {
    poVar16 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(poVar16,"this");
    __cxa_throw(poVar16,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  while( true ) {
    (**(_func_int **)((long)local_138 + 0x18))(local_3c8,local_138);
    (**(_func_int **)((long)local_138 + 0x10))(local_138);
    iVar12 = (**(_func_int **)((long)local_138 + 8))(local_138);
    if ((char)iVar12 == '\0') break;
    local_3c8 = (undefined1  [8])&PTR_Init_00157638;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3c0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3c0._8_8_);
    }
  }
  local_318.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_3c0._0_8_;
  local_318.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3c0._8_8_;
  local_318.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_001576d0;
  local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,local_3b0[0]);
  sVar15 = linq::IEnumerable<int_&>::Count(&local_318);
  assertEquals<int,unsigned_long>(2,sVar15);
  local_318.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_00157638;
  if (local_318.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_318.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_138 = (undefined1  [8])&PTR_Init_00156eb0;
  std::
  _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
               *)&local_e8);
  if (local_f8._vptr_IState != (_func_int **)0x0) {
    (*(code *)local_f8._vptr_IState)(local_108,local_108,3);
  }
  IStack_130._vptr_IState = (_func_int **)&PTR_Init_00156c18;
  local_128._vptr_IState = (_func_int **)&PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._M_current !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._M_current);
  }
  local_3b0._0_8_ =
       (local_328->source).state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_3b0._8_8_ =
       (local_328->source).state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_ ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_3c8 = (undefined1  [8])&PTR_Init_00156f18;
    local_3c0._0_8_ = &PTR_Init_00156c18;
    local_3c0._8_8_ = &PTR_Init_00156bc0;
    local_3b0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_)->_M_use_count + 1;
      UNLOCK();
      if (__libc_single_threaded != '\0') {
        _Var17 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_)->_M_use_count;
        goto LAB_001091bf;
      }
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      _Var17 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_)->_M_use_count + 1;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_)->_M_use_count = _Var17;
LAB_001091bf:
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_)->_M_use_count = _Var17 + 1;
    }
    local_3c0._8_8_ = &PTR_Init_00156bc0;
    local_3c0._0_8_ = &PTR_Init_00156c18;
    local_3c8 = (undefined1  [8])&PTR_Init_00156f18;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_);
  }
  linq::
  WhereState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:25:36),_int>
  ::Init((WhereState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:25:36),_int>
          *)local_3c8);
  uVar4 = local_3b0._0_8_;
  iVar12 = (*(*(_func_int ***)local_3b0._0_8_)[1])(local_3b0._0_8_);
  if ((char)iVar12 == '\0') {
    poVar16 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(poVar16,"this");
LAB_0010ca60:
    __cxa_throw(poVar16,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  iVar12 = (*(*(_func_int ***)uVar4)[3])(uVar4);
  linq::
  WhereState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:25:36),_int>
  ::Advance((WhereState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:25:36),_int>
             *)local_3c8);
  iVar13 = (*(*(_func_int ***)uVar4)[1])(uVar4);
  if ((char)iVar13 != '\0') {
    poVar16 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(poVar16,"this");
    goto LAB_0010ca60;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_);
  }
  assertEquals<int,int>(5,iVar12);
  local_318.super_IState<int_&>._vptr_IState = (_func_int **)0x500000001;
  local_318.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x700000006;
  local_318.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._0_4_ = 5;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_318;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_1d8,__l,(allocator_type *)local_270);
  linq::Adapt<std::vector<int,std::allocator<int>>,void>
            ((IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> *
             )local_138,(linq *)local_1d8,source_00);
  linq::IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>>::
  Intersect<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>>&>
            ((IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>_>
              *)local_3c8,
             (IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>> *)
             local_138,
             (IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>
              *)local_328);
  linq::
  IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>
  ::Init((IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>
          *)local_3c8);
  iVar12 = (*(*(_func_int ***)local_388._16_8_)[1])();
  if ((char)iVar12 == '\0') {
    poVar16 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(poVar16,"this");
    __cxa_throw(poVar16,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  iVar13 = (*(*(_func_int ***)local_388._16_8_)[3])();
  linq::
  IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>
  ::Advance((IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>
             *)local_3c8);
  iVar12 = (*(*(_func_int ***)local_388._16_8_)[1])();
  cVar9 = (char)iVar12;
  iVar12 = iVar13;
  while (cVar9 != '\0') {
    iVar14 = (*((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._16_8_)->
               _vptr__Sp_counted_base[3])();
    linq::
    IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>
    ::Advance((IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>
               *)local_3c8);
    if (iVar14 < iVar12) {
      iVar13 = iVar14;
      iVar12 = iVar14;
    }
    iVar14 = (*(*(_func_int ***)local_388._16_8_)[1])();
    cVar9 = (char)iVar14;
  }
  assertEquals<int,int>(5,iVar13);
  local_3c8 = (undefined1  [8])&PTR_Init_00156f60;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_360);
  local_388._0_8_ = &PTR_Init_00156c18;
  local_388._8_8_ = &PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_370._M_current !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_370._M_current);
  }
  local_3c0._8_8_ = &PTR_Init_00157230;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    operator_delete((void *)local_3b0._0_8_,(long)local_3a0._M_pi - local_3b0._0_8_);
  }
  local_138 = (undefined1  [8])&PTR_Init_00157230;
  if (IStack_130._vptr_IState != (_func_int **)0x0) {
    operator_delete(IStack_130._vptr_IState,(long)local_120._M_pi - (long)IStack_130._vptr_IState);
  }
  if (local_1d8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1d8,(long)local_1c8._vptr_IState - (long)local_1d8);
  }
  local_318.super_IState<int_&>._vptr_IState = (_func_int **)0x500000001;
  local_318.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x700000006;
  local_318.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._0_4_ = 5;
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&local_318;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_1d8,__l_00,(allocator_type *)local_270);
  linq::Adapt<std::vector<int,std::allocator<int>>,void>
            ((IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> *
             )local_138,(linq *)local_1d8,source_01);
  linq::IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>>::
  Intersect<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>>&>
            ((IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>_>
              *)local_3c8,
             (IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>> *)
             local_138,
             (IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>
              *)local_328);
  linq::
  IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>
  ::Init((IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>
          *)local_3c8);
  iVar12 = (*(*(_func_int ***)local_388._16_8_)[1])();
  if ((char)iVar12 == '\0') {
    poVar16 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(poVar16,"this");
    __cxa_throw(poVar16,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  iVar13 = (*(*(_func_int ***)local_388._16_8_)[3])();
  linq::
  IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>
  ::Advance((IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>
             *)local_3c8);
  iVar12 = (*(*(_func_int ***)local_388._16_8_)[1])();
  cVar9 = (char)iVar12;
  iVar12 = iVar13;
  while (cVar9 != '\0') {
    iVar14 = (*((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._16_8_)->
               _vptr__Sp_counted_base[3])();
    linq::
    IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>
    ::Advance((IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>
               *)local_3c8);
    if (iVar12 < iVar14) {
      iVar13 = iVar14;
      iVar12 = iVar14;
    }
    iVar14 = (*(*(_func_int ***)local_388._16_8_)[1])();
    cVar9 = (char)iVar14;
  }
  assertEquals<int,int>(7,iVar13);
  local_3c8 = (undefined1  [8])&PTR_Init_00156f60;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_360);
  local_388._0_8_ = &PTR_Init_00156c18;
  local_388._8_8_ = &PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_370._M_current !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_370._M_current);
  }
  local_3c0._8_8_ = &PTR_Init_00157230;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    operator_delete((void *)local_3b0._0_8_,(long)local_3a0._M_pi - local_3b0._0_8_);
  }
  local_138 = (undefined1  [8])&PTR_Init_00157230;
  if (IStack_130._vptr_IState != (_func_int **)0x0) {
    operator_delete(IStack_130._vptr_IState,(long)local_120._M_pi - (long)IStack_130._vptr_IState);
  }
  if (local_1d8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1d8,(long)local_1c8._vptr_IState - (long)local_1d8);
  }
  local_48[0] = 1;
  local_48[1] = 5;
  local_48[2] = 6;
  local_48[3] = 7;
  local_48[4] = 5;
  __l_01._M_len = 5;
  __l_01._M_array = local_48;
  std::vector<int,_std::allocator<int>_>::vector(&local_90,__l_01,&local_319);
  linq::Adapt<std::vector<int,std::allocator<int>>,void>(&local_78,(linq *)&local_90,source_02);
  linq::IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>>::
  Intersect<linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,main::__0,int>>&>
            ((IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>_>
              *)local_270,
             (IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>> *)
             &local_78,
             (IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>
              *)local_328);
  local_3c8 = (undefined1  [8])&PTR_Init_00156f60;
  local_3c0._8_8_ = &PTR_Init_00157230;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_3b0,&local_258);
  local_398._0_8_ = local_240._0_8_;
  local_398._8_8_ = local_240._8_8_;
  local_388._0_8_ = &PTR_Init_00156c18;
  local_388._8_8_ = &PTR_Init_00156bc0;
  local_388._16_8_ = local_230._16_8_;
  local_370._M_current = (int *)local_218._M_pi;
  if (local_218._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_218._M_pi)->_M_use_count = (local_218._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_218._M_pi)->_M_use_count = (local_218._M_pi)->_M_use_count + 1;
    }
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_360,&local_208);
  linq::
  IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
  ::iterator::iterator
            ((iterator *)local_138,
             (IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>
              *)local_3c8,true);
  local_3c8 = (undefined1  [8])&PTR_Init_00156f60;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_360);
  local_388._0_8_ = &PTR_Init_00156c18;
  local_388._8_8_ = &PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_370._M_current !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_370._M_current);
  }
  local_3c0._8_8_ = &PTR_Init_00157230;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    operator_delete((void *)local_3b0._0_8_,(long)local_3a0._M_pi - local_3b0._0_8_);
  }
  local_3c8 = (undefined1  [8])&PTR_Init_00156f60;
  local_3c0._8_8_ = &PTR_Init_00157230;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_3b0,&local_258);
  local_398._0_8_ = local_240._0_8_;
  local_398._8_8_ = local_240._8_8_;
  local_388._0_8_ = &PTR_Init_00156c18;
  local_388._8_8_ = &PTR_Init_00156bc0;
  local_388._16_8_ = local_230._16_8_;
  local_370._M_current = (int *)local_218._M_pi;
  if (local_218._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_218._M_pi)->_M_use_count = (local_218._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_218._M_pi)->_M_use_count = (local_218._M_pi)->_M_use_count + 1;
    }
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_360,&local_208);
  linq::
  IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
  ::iterator::iterator
            ((iterator *)local_1d8,
             (IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>
              *)local_3c8,false);
  local_3c8 = (undefined1  [8])&PTR_Init_00156f60;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_360);
  local_388._0_8_ = &PTR_Init_00156c18;
  local_388._8_8_ = &PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_370._M_current !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_370._M_current);
  }
  local_3c0._8_8_ = &PTR_Init_00157230;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    operator_delete((void *)local_3b0._0_8_,(long)local_3a0._M_pi - local_3b0._0_8_);
  }
  uVar18 = 0;
  while( true ) {
    local_318.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_00156f60;
    local_318.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR_Init_00157230;
    std::vector<int,_std::allocator<int>_>::vector
              (&local_300,(vector<int,_std::allocator<int>_> *)local_1c0);
    local_2e8._0_8_ = local_1a8._0_8_;
    local_2e8._8_8_ = local_1a8._8_8_;
    local_2d8._0_8_ = &PTR_Init_00156c18;
    local_2d8._8_8_ = &PTR_Init_00156bc0;
    local_2d8._16_8_ = local_198._16_8_;
    local_2c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180._M_current;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180._M_current !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_180._M_current[2] = local_180._M_current[2] + 1;
        UNLOCK();
      }
      else {
        local_180._M_current[2] = local_180._M_current[2] + 1;
      }
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_2b0,
               (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_170);
    local_280 = local_140;
    local_3c8 = (undefined1  [8])&PTR_Init_00156f60;
    local_3c0._8_8_ = &PTR_Init_00157230;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_3b0,&local_300);
    local_398._0_8_ = local_2e8._0_8_;
    local_398._8_8_ = local_2e8._8_8_;
    local_388._0_8_ = &PTR_Init_00156c18;
    local_388._8_8_ = &PTR_Init_00156bc0;
    local_388._16_8_ = local_2d8._16_8_;
    local_370._M_current = (int *)local_2c0;
    if (local_2c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_2c0->_M_use_count = local_2c0->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_2c0->_M_use_count = local_2c0->_M_use_count + 1;
      }
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_360,
               (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_2b0);
    bVar10 = local_a0;
    bVar8 = local_280;
    local_330 = local_280;
    local_3c8 = (undefined1  [8])&PTR_Init_00156f60;
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_360);
    local_388._0_8_ = &PTR_Init_00156c18;
    local_388._8_8_ = &PTR_Init_00156bc0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_370._M_current !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_370._M_current);
    }
    local_3c0._8_8_ = &PTR_Init_00157230;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._0_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      operator_delete((void *)local_3b0._0_8_,(long)local_3a0._M_pi - local_3b0._0_8_);
    }
    local_318.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_00156f60;
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_2b0);
    local_2d8._0_8_ = &PTR_Init_00156c18;
    local_2d8._8_8_ = &PTR_Init_00156bc0;
    if (local_2c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2c0);
    }
    local_318.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR_Init_00157230;
    if (local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (((bVar10 | bVar8) & 1) == 0) break;
    (*(local_e8._M_pi)->_vptr__Sp_counted_base[3])();
    linq::
    IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>
    ::Advance((IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>
               *)local_138);
    uVar18 = uVar18 + 1;
    iVar12 = (*(local_e8._M_pi)->_vptr__Sp_counted_base[1])();
    local_a0 = SUB41(iVar12,0);
  }
  local_1d8 = (undefined1  [8])&PTR_Init_00156f60;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_170);
  local_198._0_8_ = &PTR_Init_00156c18;
  local_198._8_8_ = &PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180._M_current !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180._M_current);
  }
  local_1c8._vptr_IState = (_func_int **)&PTR_Init_00157230;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    operator_delete((void *)local_1c0._0_8_,
                    CONCAT71(local_1c0._17_7_,local_1c0[0x10]) - local_1c0._0_8_);
  }
  local_138 = (undefined1  [8])&PTR_Init_00156f60;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_d0);
  local_f8._vptr_IState = (_func_int **)&PTR_Init_00156c18;
  local_f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR_Init_00156bc0;
  if ((_Base_ptr)local_e0._M_current != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._M_current);
  }
  local_128._vptr_IState = (_func_int **)&PTR_Init_00157230;
  if (local_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    operator_delete(local_120._M_pi,CONCAT71(uStack_10f,local_110) - (long)local_120._M_pi);
  }
  assertEquals<int,unsigned_long>(3,uVar18);
  local_270._0_8_ = &PTR_Init_00156f60;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_208);
  local_230._0_8_ = &PTR_Init_00156c18;
  local_230._8_8_ = &PTR_Init_00156bc0;
  if (local_218._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_218._M_pi);
  }
  local_260._vptr_IState = (_func_int **)&PTR_Init_00157230;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    operator_delete(local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_78.source.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_00157230;
  if (local_78.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.source.source.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.source.source.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_48[0] = 1;
  local_48[1] = 5;
  local_48[2] = 6;
  local_48[3] = 7;
  local_48[4] = 5;
  __l_02._M_len = 5;
  __l_02._M_array = local_48;
  std::vector<int,_std::allocator<int>_>::vector(&local_90,__l_02,&local_319);
  linq::Adapt<std::vector<int,std::allocator<int>>,void>(&local_78,(linq *)&local_90,source_03);
  local_3b0._8_8_ =
       (local_328->source).state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_3a0._M_pi =
       (local_328->source).state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  local_3c8 = (undefined1  [8])&PTR_Init_00156fa8;
  local_3c0._8_8_ = &PTR_Init_00156c18;
  local_3b0._0_8_ = &PTR_Init_00156bc0;
  if (local_3a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_3a0._M_pi)->_M_use_count = (local_3a0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_3a0._M_pi)->_M_use_count = (local_3a0._M_pi)->_M_use_count + 1;
    }
  }
  local_398._8_8_ = &PTR_Init_00157230;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_388,&local_78.source.source);
  local_348._M_node = (_Base_ptr)&local_358;
  local_370._M_current = local_78.source.current._M_current;
  iStack_368._M_current = local_78.source.end._M_current;
  local_358 = (_Base_ptr)((ulong)local_358._4_4_ << 0x20);
  local_350 = (_Base_ptr)0x0;
  local_338 = 0;
  local_270._0_8_ = &PTR_Init_00156fa8;
  local_260._vptr_IState = (_func_int **)&PTR_Init_00156c18;
  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&PTR_Init_00156bc0;
  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)local_3b0._8_8_;
  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_3a0._M_pi;
  if (local_3a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_3a0._M_pi)->_M_use_count = (local_3a0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_3a0._M_pi)->_M_use_count = (local_3a0._M_pi)->_M_use_count + 1;
    }
  }
  local_240._8_8_ = &PTR_Init_00157230;
  local_340 = local_348._M_node;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_230,
             (vector<int,_std::allocator<int>_> *)local_388);
  local_218._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_370._M_current;
  p_Stack_210 = (_Base_ptr)iStack_368._M_current;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
            (&local_208,
             (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_360);
  local_3c8 = (undefined1  [8])&PTR_Init_00156fa8;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_360);
  local_398._8_8_ = &PTR_Init_00157230;
  if ((_func_int **)local_388._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_388._0_8_,local_388._16_8_ - local_388._0_8_);
  }
  local_3c0._8_8_ = &PTR_Init_00156c18;
  local_3b0._0_8_ = &PTR_Init_00156bc0;
  if (local_3a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3a0._M_pi);
  }
  local_3c8 = (undefined1  [8])&PTR_Init_00156fa8;
  local_3c0._8_8_ = &PTR_Init_00156c18;
  local_3b0._0_8_ = &PTR_Init_00156bc0;
  local_3b0._8_8_ =
       local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_3a0._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)
       ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage + 8) =
           *(_Atomic_word *)
            ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)
       ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage + 8) =
           *(_Atomic_word *)
            ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 8) + 1;
    }
  }
  local_398._8_8_ = &PTR_Init_00157230;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_388,
             (vector<int,_std::allocator<int>_> *)local_230);
  local_370._M_current = (int *)local_218._M_pi;
  iStack_368._M_current = (int *)p_Stack_210;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_360,&local_208);
  linq::
  IEnumerableCore<linq::IntersectState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
  ::iterator::iterator
            ((iterator *)local_138,
             (IntersectState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>
              *)local_3c8,true);
  local_3c8 = (undefined1  [8])&PTR_Init_00156fa8;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_360);
  local_398._8_8_ = &PTR_Init_00157230;
  if ((_func_int **)local_388._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_388._0_8_,local_388._16_8_ - local_388._0_8_);
  }
  local_3c0._8_8_ = &PTR_Init_00156c18;
  local_3b0._0_8_ = &PTR_Init_00156bc0;
  if (local_3a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3a0._M_pi);
  }
  local_3c8 = (undefined1  [8])&PTR_Init_00156fa8;
  local_3c0._8_8_ = &PTR_Init_00156c18;
  local_3b0._0_8_ = &PTR_Init_00156bc0;
  local_3b0._8_8_ =
       local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_3a0._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)
       ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage + 8) =
           *(_Atomic_word *)
            ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)
       ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage + 8) =
           *(_Atomic_word *)
            ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 8) + 1;
    }
  }
  local_398._8_8_ = &PTR_Init_00157230;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_388,
             (vector<int,_std::allocator<int>_> *)local_230);
  local_370._M_current = (int *)local_218._M_pi;
  iStack_368._M_current = (int *)p_Stack_210;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_360,&local_208);
  linq::
  IEnumerableCore<linq::IntersectState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
  ::iterator::iterator
            ((iterator *)local_1d8,
             (IntersectState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>
              *)local_3c8,false);
  local_3c8 = (undefined1  [8])&PTR_Init_00156fa8;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_360);
  local_398._8_8_ = &PTR_Init_00157230;
  if ((_func_int **)local_388._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_388._0_8_,local_388._16_8_ - local_388._0_8_);
  }
  local_3c0._8_8_ = &PTR_Init_00156c18;
  local_3b0._0_8_ = &PTR_Init_00156bc0;
  if (local_3a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3a0._M_pi);
  }
  uVar18 = 0;
  while( true ) {
    local_318.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_00156fa8;
    local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)CONCAT71(local_1c0._17_7_,local_1c0[0x10]);
    local_318.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR_Init_00156c18;
    local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)&PTR_Init_00156bc0;
    local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)local_1c0._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage)->_M_use_count + 1;
      }
    }
    local_2e8._8_8_ = &PTR_Init_00157230;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_2d8,
               (vector<int,_std::allocator<int>_> *)local_198);
    local_2c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180._M_current;
    p_Stack_2b8 = (_Base_ptr)iStack_178._M_current;
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_2b0,
               (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_170);
    local_280 = local_140;
    local_3c8 = (undefined1  [8])&PTR_Init_00156fa8;
    local_3c0._8_8_ = &PTR_Init_00156c18;
    local_3b0._0_8_ = &PTR_Init_00156bc0;
    local_3b0._8_8_ =
         local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    local_3a0._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)
         ((long)local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + 8) =
             *(_Atomic_word *)
              ((long)local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)
         ((long)local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + 8) =
             *(_Atomic_word *)
              ((long)local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 8) + 1;
      }
    }
    local_398._8_8_ = &PTR_Init_00157230;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_388,
               (vector<int,_std::allocator<int>_> *)local_2d8);
    local_370._M_current = (int *)local_2c0;
    iStack_368._M_current = (int *)p_Stack_2b8;
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_360,
               (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_2b0);
    bVar10 = local_a0;
    bVar8 = local_280;
    local_330 = local_280;
    local_3c8 = (undefined1  [8])&PTR_Init_00156fa8;
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_360);
    local_398._8_8_ = &PTR_Init_00157230;
    if ((_func_int **)local_388._0_8_ != (_func_int **)0x0) {
      operator_delete((void *)local_388._0_8_,local_388._16_8_ - local_388._0_8_);
    }
    local_3c0._8_8_ = &PTR_Init_00156c18;
    local_3b0._0_8_ = &PTR_Init_00156bc0;
    if (local_3a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3a0._M_pi);
    }
    local_318.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_00156fa8;
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_2b0);
    local_2e8._8_8_ = &PTR_Init_00157230;
    if ((undefined **)local_2d8._0_8_ != (undefined **)0x0) {
      operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ - local_2d8._0_8_);
    }
    local_318.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR_Init_00156c18;
    local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)&PTR_Init_00156bc0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
    }
    if (((bVar10 | bVar8) & 1) == 0) break;
    uVar18 = uVar18 + 1;
    linq::
    IntersectState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>
    ::Advance((IntersectState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>
               *)local_138);
    local_a0 = local_e0._M_current != local_d8._M_current;
  }
  local_1d8 = (undefined1  [8])&PTR_Init_00156fa8;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_170);
  local_1a8._8_8_ = &PTR_Init_00157230;
  if ((IState<int> *)local_198._0_8_ != (IState<int> *)0x0) {
    operator_delete((void *)local_198._0_8_,local_198._16_8_ - local_198._0_8_);
  }
  local_1c8._vptr_IState = (_func_int **)&PTR_Init_00156c18;
  local_1c0._0_8_ = &PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(local_1c0._17_7_,local_1c0[0x10]) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(local_1c0._17_7_,local_1c0[0x10]));
  }
  local_138 = (undefined1  [8])&PTR_Init_00156fa8;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_d0);
  local_100 = &PTR_Init_00157230;
  if (local_f8._vptr_IState != (_func_int **)0x0) {
    operator_delete(local_f8._vptr_IState,(long)local_e8._M_pi - (long)local_f8._vptr_IState);
  }
  local_128._vptr_IState = (_func_int **)&PTR_Init_00156c18;
  local_120._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(uStack_10f,local_110) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(uStack_10f,local_110));
  }
  assertEquals<int,unsigned_long>(3,uVar18);
  local_270._0_8_ = &PTR_Init_00156fa8;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_208);
  local_240._8_8_ = &PTR_Init_00157230;
  if ((_func_int **)local_230._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_230._0_8_,local_230._16_8_ - local_230._0_8_);
  }
  local_260._vptr_IState = (_func_int **)&PTR_Init_00156c18;
  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  }
  local_78.source.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_00157230;
  if (local_78.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.source.source.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.source.source.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_48[0] = 1;
  local_48[1] = 5;
  local_48[2] = 6;
  local_48[3] = 7;
  local_48[4] = 5;
  __l_03._M_len = 5;
  __l_03._M_array = local_48;
  std::vector<int,_std::allocator<int>_>::vector(&local_90,__l_03,&local_319);
  linq::Adapt<std::vector<int,std::allocator<int>>,void>(&local_78,(linq *)&local_90,source_04);
  local_3b0._8_8_ =
       (local_328->source).state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_3a0._M_pi =
       (local_328->source).state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  local_3c8 = (undefined1  [8])&PTR_Init_00156ff0;
  local_3c0._8_8_ = &PTR_Init_00156c18;
  local_3b0._0_8_ = &PTR_Init_00156bc0;
  if (local_3a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_3a0._M_pi)->_M_use_count = (local_3a0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_3a0._M_pi)->_M_use_count = (local_3a0._M_pi)->_M_use_count + 1;
    }
  }
  local_398._8_8_ = &PTR_Init_00157230;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_388,&local_78.source.source);
  local_370._M_current = local_78.source.current._M_current;
  iStack_368._M_current = local_78.source.end._M_current;
  local_358 = (_Base_ptr)((ulong)local_358 & 0xffffffff00000000);
  local_350 = (_Base_ptr)0x0;
  local_348._M_node = (_Base_ptr)&local_358;
  local_338 = 0;
  local_270._0_8_ = &PTR_Init_00156ff0;
  local_260._vptr_IState = (_func_int **)&PTR_Init_00156c18;
  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&PTR_Init_00156bc0;
  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)local_3b0._8_8_;
  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_3a0._M_pi;
  if (local_3a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_3a0._M_pi)->_M_use_count = (local_3a0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_3a0._M_pi)->_M_use_count = (local_3a0._M_pi)->_M_use_count + 1;
    }
  }
  local_240._8_8_ = &PTR_Init_00157230;
  local_340 = local_348._M_node;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_230,
             (vector<int,_std::allocator<int>_> *)local_388);
  local_218._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_370._M_current;
  p_Stack_210 = (_Base_ptr)iStack_368._M_current;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
            (&local_208,
             (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_360);
  local_3c8 = (undefined1  [8])&PTR_Init_00156ff0;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_360);
  local_398._8_8_ = &PTR_Init_00157230;
  if ((_func_int **)local_388._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_388._0_8_,local_388._16_8_ - local_388._0_8_);
  }
  local_3c0._8_8_ = &PTR_Init_00156c18;
  local_3b0._0_8_ = &PTR_Init_00156bc0;
  if (local_3a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3a0._M_pi);
  }
  local_3c8 = (undefined1  [8])&PTR_Init_00156ff0;
  local_3c0._8_8_ = &PTR_Init_00156c18;
  local_3b0._0_8_ = &PTR_Init_00156bc0;
  local_3b0._8_8_ =
       local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_3a0._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)
       ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage + 8) =
           *(_Atomic_word *)
            ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)
       ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage + 8) =
           *(_Atomic_word *)
            ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 8) + 1;
    }
  }
  local_398._8_8_ = &PTR_Init_00157230;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_388,
             (vector<int,_std::allocator<int>_> *)local_230);
  local_370._M_current = (int *)local_218._M_pi;
  iStack_368._M_current = (int *)p_Stack_210;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_360,&local_208);
  linq::
  IEnumerableCore<linq::ExceptState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:137:13),_int>_>
  ::iterator::iterator
            ((iterator *)local_138,
             (ExceptState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:137:13),_int>
              *)local_3c8,true);
  local_3c8 = (undefined1  [8])&PTR_Init_00156ff0;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_360);
  local_398._8_8_ = &PTR_Init_00157230;
  if ((_func_int **)local_388._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_388._0_8_,local_388._16_8_ - local_388._0_8_);
  }
  local_3c0._8_8_ = &PTR_Init_00156c18;
  local_3b0._0_8_ = &PTR_Init_00156bc0;
  if (local_3a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3a0._M_pi);
  }
  local_3c8 = (undefined1  [8])&PTR_Init_00156ff0;
  local_3c0._8_8_ = &PTR_Init_00156c18;
  local_3b0._0_8_ = &PTR_Init_00156bc0;
  local_3b0._8_8_ =
       local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_3a0._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)
       ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage + 8) =
           *(_Atomic_word *)
            ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)
       ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage + 8) =
           *(_Atomic_word *)
            ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 8) + 1;
    }
  }
  local_398._8_8_ = &PTR_Init_00157230;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_388,
             (vector<int,_std::allocator<int>_> *)local_230);
  local_370._M_current = (int *)local_218._M_pi;
  iStack_368._M_current = (int *)p_Stack_210;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_360,&local_208);
  linq::
  IEnumerableCore<linq::ExceptState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:137:13),_int>_>
  ::iterator::iterator
            ((iterator *)local_1d8,
             (ExceptState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:137:13),_int>
              *)local_3c8,false);
  local_3c8 = (undefined1  [8])&PTR_Init_00156ff0;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_360);
  local_398._8_8_ = &PTR_Init_00157230;
  if ((_func_int **)local_388._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_388._0_8_,local_388._16_8_ - local_388._0_8_);
  }
  local_3c0._8_8_ = &PTR_Init_00156c18;
  local_3b0._0_8_ = &PTR_Init_00156bc0;
  if (local_3a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3a0._M_pi);
  }
  uVar18 = 0;
  while( true ) {
    local_318.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_00156ff0;
    local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)CONCAT71(local_1c0._17_7_,local_1c0[0x10]);
    local_318.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR_Init_00156c18;
    local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)&PTR_Init_00156bc0;
    local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)local_1c0._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage)->_M_use_count + 1;
      }
    }
    local_2e8._8_8_ = &PTR_Init_00157230;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_2d8,
               (vector<int,_std::allocator<int>_> *)local_198);
    local_2c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180._M_current;
    p_Stack_2b8 = (_Base_ptr)iStack_178._M_current;
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_2b0,
               (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_170);
    local_280 = local_140;
    local_3c8 = (undefined1  [8])&PTR_Init_00156ff0;
    local_3c0._8_8_ = &PTR_Init_00156c18;
    local_3b0._0_8_ = &PTR_Init_00156bc0;
    local_3b0._8_8_ =
         local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    local_3a0._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)
         ((long)local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + 8) =
             *(_Atomic_word *)
              ((long)local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)
         ((long)local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + 8) =
             *(_Atomic_word *)
              ((long)local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 8) + 1;
      }
    }
    local_398._8_8_ = &PTR_Init_00157230;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_388,
               (vector<int,_std::allocator<int>_> *)local_2d8);
    local_370._M_current = (int *)local_2c0;
    iStack_368._M_current = (int *)p_Stack_2b8;
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_360,
               (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_2b0);
    bVar10 = local_a0;
    bVar8 = local_280;
    local_330 = local_280;
    local_3c8 = (undefined1  [8])&PTR_Init_00156ff0;
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_360);
    local_398._8_8_ = &PTR_Init_00157230;
    if ((_func_int **)local_388._0_8_ != (_func_int **)0x0) {
      operator_delete((void *)local_388._0_8_,local_388._16_8_ - local_388._0_8_);
    }
    local_3c0._8_8_ = &PTR_Init_00156c18;
    local_3b0._0_8_ = &PTR_Init_00156bc0;
    if (local_3a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3a0._M_pi);
    }
    local_318.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_00156ff0;
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_2b0);
    local_2e8._8_8_ = &PTR_Init_00157230;
    if ((undefined **)local_2d8._0_8_ != (undefined **)0x0) {
      operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ - local_2d8._0_8_);
    }
    local_318.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR_Init_00156c18;
    local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)&PTR_Init_00156bc0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
    }
    if (((bVar10 | bVar8) & 1) == 0) break;
    (**(code **)(*(long *)local_118._M_current + 0x18))();
    linq::
    ExceptState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:137:13),_int>
    ::Advance((ExceptState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:137:13),_int>
               *)local_138);
    uVar18 = uVar18 + 1;
    local_a0 = (bool)(**(code **)(*(long *)local_118._M_current + 8))();
  }
  local_1d8 = (undefined1  [8])&PTR_Init_00156ff0;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_170);
  local_1a8._8_8_ = &PTR_Init_00157230;
  if ((IState<int> *)local_198._0_8_ != (IState<int> *)0x0) {
    operator_delete((void *)local_198._0_8_,local_198._16_8_ - local_198._0_8_);
  }
  local_1c8._vptr_IState = (_func_int **)&PTR_Init_00156c18;
  local_1c0._0_8_ = &PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(local_1c0._17_7_,local_1c0[0x10]) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(local_1c0._17_7_,local_1c0[0x10]));
  }
  local_138 = (undefined1  [8])&PTR_Init_00156ff0;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_d0);
  local_100 = &PTR_Init_00157230;
  if (local_f8._vptr_IState != (_func_int **)0x0) {
    operator_delete(local_f8._vptr_IState,(long)local_e8._M_pi - (long)local_f8._vptr_IState);
  }
  local_128._vptr_IState = (_func_int **)&PTR_Init_00156c18;
  local_120._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(uStack_10f,local_110) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(uStack_10f,local_110));
  }
  assertEquals<int,unsigned_long>(5,uVar18);
  local_270._0_8_ = &PTR_Init_00156ff0;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_208);
  local_240._8_8_ = &PTR_Init_00157230;
  if ((_func_int **)local_230._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_230._0_8_,local_230._16_8_ - local_230._0_8_);
  }
  local_260._vptr_IState = (_func_int **)&PTR_Init_00156c18;
  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  }
  local_78.source.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_00157230;
  if (local_78.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.source.source.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.source.source.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_78.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x18);
  ((IState<int> *)
  local_78.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start)->_vptr_IState = (_func_int **)&PTR_Init_001572d0;
  ((IState<int> *)
  ((long)local_78.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start + 8))->_vptr_IState = (_func_int **)0x900000005;
  local_78.source.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_00156bc0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<linq::IState<int>*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_78.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish,
             (IState<int> *)
             local_78.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start);
  local_3b0._8_8_ =
       (local_328->source).state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_3a0._M_pi =
       (local_328->source).state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  local_3c8 = (undefined1  [8])&PTR_Init_00157038;
  local_3c0._8_8_ = &PTR_Init_00156c18;
  local_3b0._0_8_ = &PTR_Init_00156bc0;
  if (local_3a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_3a0._M_pi)->_M_use_count = (local_3a0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_3a0._M_pi)->_M_use_count = (local_3a0._M_pi)->_M_use_count + 1;
    }
  }
  local_398._8_8_ = &PTR_Init_00156bc0;
  local_388._0_8_ =
       local_78.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_388._8_8_ =
       local_78.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_78.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)
       ((long)local_78.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish + 8) =
           *(_Atomic_word *)
            ((long)local_78.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)
       ((long)local_78.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish + 8) =
           *(_Atomic_word *)
            ((long)local_78.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 8) + 1;
    }
  }
  local_370._M_current = local_370._M_current & 0xffffffff00000000;
  iStack_368._M_current = (int *)0x0;
  local_360 = (undefined1  [8])&local_370;
  local_350 = (_Base_ptr)0x0;
  local_270._0_8_ = &PTR_Init_00157038;
  local_260._vptr_IState = (_func_int **)&PTR_Init_00156c18;
  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&PTR_Init_00156bc0;
  if (local_3a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_3a0._M_pi)->_M_use_count = (local_3a0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_3a0._M_pi)->_M_use_count = (local_3a0._M_pi)->_M_use_count + 1;
    }
  }
  local_240._8_8_ = &PTR_Init_00156bc0;
  local_230._0_8_ =
       local_78.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_230._8_8_ =
       local_78.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_78.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)
       ((long)local_78.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish + 8) =
           *(_Atomic_word *)
            ((long)local_78.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)
       ((long)local_78.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish + 8) =
           *(_Atomic_word *)
            ((long)local_78.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 8) + 1;
    }
  }
  p_Var1 = (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
           (local_230 + 0x10);
  local_358 = (_Base_ptr)local_360;
  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)local_3b0._8_8_;
  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_3a0._M_pi;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
            (p_Var1,(_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *
                    )(local_388 + 0x10));
  local_3c8 = (undefined1  [8])&PTR_Init_00157038;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             (local_388 + 0x10));
  local_398._8_8_ = &PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._8_8_);
  }
  local_3c0._8_8_ = &PTR_Init_00156c18;
  local_3b0._0_8_ = &PTR_Init_00156bc0;
  if (local_3a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3a0._M_pi);
  }
  local_3c8 = (undefined1  [8])&PTR_Init_00157038;
  local_3c0._8_8_ = &PTR_Init_00156c18;
  local_3b0._0_8_ = &PTR_Init_00156bc0;
  local_3b0._8_8_ =
       local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_3a0._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)
       ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage + 8) =
           *(_Atomic_word *)
            ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)
       ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage + 8) =
           *(_Atomic_word *)
            ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 8) + 1;
    }
  }
  local_398._8_8_ = &PTR_Init_00156bc0;
  local_388._0_8_ = local_230._0_8_;
  local_388._8_8_ = local_230._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_230._8_8_ + 8) = *(_Atomic_word *)(local_230._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_230._8_8_ + 8) = *(_Atomic_word *)(local_230._8_8_ + 8) + 1;
    }
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             (local_388 + 0x10),p_Var1);
  linq::
  IEnumerableCore<linq::ExceptState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:137:13),_int>_>
  ::iterator::iterator
            ((iterator *)local_138,
             (ExceptState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:137:13),_int>
              *)local_3c8,true);
  local_3c8 = (undefined1  [8])&PTR_Init_00157038;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             (local_388 + 0x10));
  local_398._8_8_ = &PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._8_8_);
  }
  local_3c0._8_8_ = &PTR_Init_00156c18;
  local_3b0._0_8_ = &PTR_Init_00156bc0;
  if (local_3a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3a0._M_pi);
  }
  local_3c8 = (undefined1  [8])&PTR_Init_00157038;
  local_3c0._8_8_ = &PTR_Init_00156c18;
  local_3b0._0_8_ = &PTR_Init_00156bc0;
  local_3b0._8_8_ =
       local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_3a0._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)
       ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage + 8) =
           *(_Atomic_word *)
            ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)
       ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage + 8) =
           *(_Atomic_word *)
            ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 8) + 1;
    }
  }
  local_398._8_8_ = &PTR_Init_00156bc0;
  local_388._0_8_ = local_230._0_8_;
  local_388._8_8_ = local_230._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_230._8_8_ + 8) = *(_Atomic_word *)(local_230._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_230._8_8_ + 8) = *(_Atomic_word *)(local_230._8_8_ + 8) + 1;
    }
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             (local_388 + 0x10),p_Var1);
  linq::
  IEnumerableCore<linq::ExceptState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:137:13),_int>_>
  ::iterator::iterator
            ((iterator *)local_1d8,
             (ExceptState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:137:13),_int>
              *)local_3c8,false);
  local_3c8 = (undefined1  [8])&PTR_Init_00157038;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             (local_388 + 0x10));
  local_398._8_8_ = &PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._8_8_);
  }
  local_3c0._8_8_ = &PTR_Init_00156c18;
  local_3b0._0_8_ = &PTR_Init_00156bc0;
  if (local_3a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3a0._M_pi);
  }
  p_Var1 = (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
           (local_2d8 + 0x10);
  uVar18 = 0;
  while( true ) {
    local_318.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_00157038;
    local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)CONCAT71(local_1c0._17_7_,local_1c0[0x10]);
    local_318.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR_Init_00156c18;
    local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)&PTR_Init_00156bc0;
    local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)local_1c0._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage)->_M_use_count + 1;
      }
    }
    local_2e8._8_8_ = &PTR_Init_00156bc0;
    local_2d8._0_8_ = local_198._0_8_;
    local_2d8._8_8_ = local_198._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_198._8_8_ + 8) = *(_Atomic_word *)(local_198._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_198._8_8_ + 8) = *(_Atomic_word *)(local_198._8_8_ + 8) + 1;
      }
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
              (p_Var1,(_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                       *)(local_198 + 0x10));
    local_298 = (_Base_ptr)CONCAT71(local_298._1_7_,local_170[0x18]);
    local_3c8 = (undefined1  [8])&PTR_Init_00157038;
    local_3c0._8_8_ = &PTR_Init_00156c18;
    local_3b0._0_8_ = &PTR_Init_00156bc0;
    local_3b0._8_8_ =
         local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    local_3a0._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)
         ((long)local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + 8) =
             *(_Atomic_word *)
              ((long)local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)
         ((long)local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + 8) =
             *(_Atomic_word *)
              ((long)local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 8) + 1;
      }
    }
    local_398._8_8_ = &PTR_Init_00156bc0;
    local_388._0_8_ = local_2d8._0_8_;
    local_388._8_8_ = local_2d8._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_2d8._8_8_ + 8) = *(_Atomic_word *)(local_2d8._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_2d8._8_8_ + 8) = *(_Atomic_word *)(local_2d8._8_8_ + 8) + 1;
      }
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               (local_388 + 0x10),p_Var1);
    bVar8 = (byte)local_298;
    local_348._M_node._0_1_ = (byte)local_298;
    bVar10 = (bool)local_b8._M_node._0_1_;
    local_3c8 = (undefined1  [8])&PTR_Init_00157038;
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               (local_388 + 0x10));
    local_398._8_8_ = &PTR_Init_00156bc0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._8_8_);
    }
    local_3c0._8_8_ = &PTR_Init_00156c18;
    local_3b0._0_8_ = &PTR_Init_00156bc0;
    if (local_3a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3a0._M_pi);
    }
    local_318.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_00157038;
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (p_Var1);
    local_2e8._8_8_ = &PTR_Init_00156bc0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_);
    }
    local_318.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR_Init_00156c18;
    local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)&PTR_Init_00156bc0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
    }
    if (((bVar10 | bVar8) & 1) == 0) break;
    (**(code **)(*(long *)local_118._M_current + 0x18))();
    linq::
    ExceptState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:137:13),_int>
    ::Advance((ExceptState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:137:13),_int>
               *)local_138);
    uVar18 = uVar18 + 1;
    uVar11 = (**(code **)(*(long *)local_118._M_current + 8))();
    local_b8._M_node._0_1_ = uVar11;
  }
  local_1d8 = (undefined1  [8])&PTR_Init_00157038;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             (local_198 + 0x10));
  local_1a8._8_8_ = &PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
  }
  local_1c8._vptr_IState = (_func_int **)&PTR_Init_00156c18;
  local_1c0._0_8_ = &PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(local_1c0._17_7_,local_1c0[0x10]) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(local_1c0._17_7_,local_1c0[0x10]));
  }
  local_138 = (undefined1  [8])&PTR_Init_00157038;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &local_e8);
  local_100 = &PTR_Init_00156bc0;
  if (local_f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0._M_pi);
  }
  local_128._vptr_IState = (_func_int **)&PTR_Init_00156c18;
  local_120._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(uStack_10f,local_110) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(uStack_10f,local_110));
  }
  assertEquals<int,unsigned_long>(3,uVar18);
  local_270._0_8_ = &PTR_Init_00157038;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             (local_230 + 0x10));
  local_240._8_8_ = &PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230._8_8_);
  }
  local_260._vptr_IState = (_func_int **)&PTR_Init_00156c18;
  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  }
  local_78.source.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_78.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_78.source.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  local_3b0._8_8_ =
       (local_328->source).state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_3a0._M_pi =
       (local_328->source).state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  local_3c8 = (undefined1  [8])&PTR_Init_00157080;
  local_3c0._8_8_ = &PTR_Init_00156c18;
  local_3b0._0_8_ = &PTR_Init_00156bc0;
  if (local_3a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_3a0._M_pi)->_M_use_count = (local_3a0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_3a0._M_pi)->_M_use_count = (local_3a0._M_pi)->_M_use_count + 1;
    }
  }
  local_388._8_8_ =
       (local_328->source).state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_388._16_8_ =
       (local_328->source).state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  local_398._8_8_ = &PTR_Init_00156c18;
  local_388._0_8_ = &PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._16_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._16_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._16_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._16_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._16_8_)->_M_use_count + 1;
    }
  }
  local_360 = (undefined1  [8])((ulong)local_360 & 0xffffffff00000000);
  local_358 = (_Base_ptr)0x0;
  local_340 = (_Base_ptr)0x0;
  local_270._0_8_ = &PTR_Init_00157080;
  local_260._vptr_IState = (_func_int **)&PTR_Init_00156c18;
  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&PTR_Init_00156bc0;
  if (local_3a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_3a0._M_pi)->_M_use_count = (local_3a0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_3a0._M_pi)->_M_use_count = (local_3a0._M_pi)->_M_use_count + 1;
    }
  }
  local_240._8_8_ = &PTR_Init_00156c18;
  local_230._0_8_ = &PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._16_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._16_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._16_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._16_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._16_8_)->_M_use_count + 1;
    }
  }
  local_350 = (_Base_ptr)local_360;
  local_348._M_node = (_Base_ptr)local_360;
  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)local_3b0._8_8_;
  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_3a0._M_pi;
  local_230._8_8_ = local_388._8_8_;
  local_230._16_8_ = local_388._16_8_;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &p_Stack_210,
             (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &iStack_368);
  local_3c8 = (undefined1  [8])&PTR_Init_00157080;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &iStack_368);
  local_398._8_8_ = &PTR_Init_00156c18;
  local_388._0_8_ = &PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._16_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._16_8_);
  }
  local_3c0._8_8_ = &PTR_Init_00156c18;
  local_3b0._0_8_ = &PTR_Init_00156bc0;
  if (local_3a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3a0._M_pi);
  }
  local_3c8 = (undefined1  [8])&PTR_Init_00157080;
  local_3c0._8_8_ = &PTR_Init_00156c18;
  local_3b0._0_8_ = &PTR_Init_00156bc0;
  local_3b0._8_8_ =
       local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_3a0._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)
       ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage + 8) =
           *(_Atomic_word *)
            ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)
       ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage + 8) =
           *(_Atomic_word *)
            ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 8) + 1;
    }
  }
  local_398._8_8_ = &PTR_Init_00156c18;
  local_388._0_8_ = &PTR_Init_00156bc0;
  local_388._8_8_ = local_230._8_8_;
  local_388._16_8_ = local_230._16_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230._16_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_230._16_8_ + 8) = *(_Atomic_word *)(local_230._16_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_230._16_8_ + 8) = *(_Atomic_word *)(local_230._16_8_ + 8) + 1;
    }
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &iStack_368,
             (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &p_Stack_210);
  linq::
  IEnumerableCore<linq::IntersectState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
  ::iterator::iterator
            ((iterator *)local_138,
             (IntersectState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>
              *)local_3c8,true);
  local_3c8 = (undefined1  [8])&PTR_Init_00157080;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &iStack_368);
  local_398._8_8_ = &PTR_Init_00156c18;
  local_388._0_8_ = &PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._16_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._16_8_);
  }
  local_3c0._8_8_ = &PTR_Init_00156c18;
  local_3b0._0_8_ = &PTR_Init_00156bc0;
  if (local_3a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3a0._M_pi);
  }
  local_3c8 = (undefined1  [8])&PTR_Init_00157080;
  local_3c0._8_8_ = &PTR_Init_00156c18;
  local_3b0._0_8_ = &PTR_Init_00156bc0;
  local_3b0._8_8_ =
       local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_3a0._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)
       ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage + 8) =
           *(_Atomic_word *)
            ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)
       ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage + 8) =
           *(_Atomic_word *)
            ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 8) + 1;
    }
  }
  local_398._8_8_ = &PTR_Init_00156c18;
  local_388._0_8_ = &PTR_Init_00156bc0;
  local_388._8_8_ = local_230._8_8_;
  local_388._16_8_ = local_230._16_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230._16_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_230._16_8_ + 8) = *(_Atomic_word *)(local_230._16_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_230._16_8_ + 8) = *(_Atomic_word *)(local_230._16_8_ + 8) + 1;
    }
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &iStack_368,
             (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &p_Stack_210);
  linq::
  IEnumerableCore<linq::IntersectState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
  ::iterator::iterator
            ((iterator *)local_1d8,
             (IntersectState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>
              *)local_3c8,false);
  local_3c8 = (undefined1  [8])&PTR_Init_00157080;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &iStack_368);
  local_398._8_8_ = &PTR_Init_00156c18;
  local_388._0_8_ = &PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._16_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._16_8_);
  }
  local_3c0._8_8_ = &PTR_Init_00156c18;
  local_3b0._0_8_ = &PTR_Init_00156bc0;
  if (local_3a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3a0._M_pi);
  }
  uVar18 = 0;
  while( true ) {
    local_318.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_00157080;
    local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)CONCAT71(local_1c0._17_7_,local_1c0[0x10]);
    local_318.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR_Init_00156c18;
    local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)&PTR_Init_00156bc0;
    local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)local_1c0._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage)->_M_use_count + 1;
      }
    }
    local_2e8._8_8_ = &PTR_Init_00156c18;
    local_2d8._0_8_ = &PTR_Init_00156bc0;
    local_2d8._8_8_ = local_198._8_8_;
    local_2d8._16_8_ = local_198._16_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_198._16_8_ + 8) = *(_Atomic_word *)(local_198._16_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_198._16_8_ + 8) = *(_Atomic_word *)(local_198._16_8_ + 8) + 1;
      }
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               &p_Stack_2b8,
               (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               &iStack_178);
    local_288 = local_148;
    local_3c8 = (undefined1  [8])&PTR_Init_00157080;
    local_3c0._8_8_ = &PTR_Init_00156c18;
    local_3b0._0_8_ = &PTR_Init_00156bc0;
    local_3b0._8_8_ =
         local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    local_3a0._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)
         ((long)local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + 8) =
             *(_Atomic_word *)
              ((long)local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)
         ((long)local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + 8) =
             *(_Atomic_word *)
              ((long)local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 8) + 1;
      }
    }
    local_398._8_8_ = &PTR_Init_00156c18;
    local_388._0_8_ = &PTR_Init_00156bc0;
    local_388._8_8_ = local_2d8._8_8_;
    local_388._16_8_ = local_2d8._16_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_2d8._16_8_ + 8) = *(_Atomic_word *)(local_2d8._16_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_2d8._16_8_ + 8) = *(_Atomic_word *)(local_2d8._16_8_ + 8) + 1;
      }
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               &iStack_368,
               (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               &p_Stack_2b8);
    bVar10 = local_a8;
    bVar8 = local_288;
    local_338 = CONCAT71(local_338._1_7_,local_288);
    local_3c8 = (undefined1  [8])&PTR_Init_00157080;
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               &iStack_368);
    local_398._8_8_ = &PTR_Init_00156c18;
    local_388._0_8_ = &PTR_Init_00156bc0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._16_8_);
    }
    local_3c0._8_8_ = &PTR_Init_00156c18;
    local_3b0._0_8_ = &PTR_Init_00156bc0;
    if (local_3a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3a0._M_pi);
    }
    local_318.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_00157080;
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               &p_Stack_2b8);
    local_2e8._8_8_ = &PTR_Init_00156c18;
    local_2d8._0_8_ = &PTR_Init_00156bc0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._16_8_);
    }
    local_318.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR_Init_00156c18;
    local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)&PTR_Init_00156bc0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
    }
    if (((bVar10 | bVar8) & 1) == 0) break;
    (*(local_f0._M_pi)->_vptr__Sp_counted_base[3])();
    linq::
    IntersectState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>
    ::Advance((IntersectState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>
               *)local_138);
    uVar18 = uVar18 + 1;
    iVar12 = (*(local_f0._M_pi)->_vptr__Sp_counted_base[1])();
    local_a8 = SUB41(iVar12,0);
  }
  local_1d8 = (undefined1  [8])&PTR_Init_00157080;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &iStack_178);
  local_1a8._8_8_ = &PTR_Init_00156c18;
  local_198._0_8_ = &PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._16_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._16_8_);
  }
  local_1c8._vptr_IState = (_func_int **)&PTR_Init_00156c18;
  local_1c0._0_8_ = &PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(local_1c0._17_7_,local_1c0[0x10]) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(local_1c0._17_7_,local_1c0[0x10]));
  }
  local_138 = (undefined1  [8])&PTR_Init_00157080;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &local_d8);
  local_100 = &PTR_Init_00156c18;
  local_f8._vptr_IState = (_func_int **)&PTR_Init_00156bc0;
  if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
  }
  local_128._vptr_IState = (_func_int **)&PTR_Init_00156c18;
  local_120._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(uStack_10f,local_110) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(uStack_10f,local_110));
  }
  assertEquals<int,unsigned_long>(8,uVar18);
  local_270._0_8_ = &PTR_Init_00157080;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &p_Stack_210);
  local_240._8_8_ = &PTR_Init_00156c18;
  local_230._0_8_ = &PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230._16_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230._16_8_);
  }
  local_260._vptr_IState = (_func_int **)&PTR_Init_00156c18;
  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  }
  local_3b0._8_8_ =
       (local_328->source).state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_3a0._M_pi =
       (local_328->source).state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  local_3c8 = (undefined1  [8])&PTR_Init_001570c8;
  local_3c0._8_8_ = &PTR_Init_00156c18;
  local_3b0._0_8_ = &PTR_Init_00156bc0;
  if (local_3a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_3a0._M_pi)->_M_use_count = (local_3a0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_3a0._M_pi)->_M_use_count = (local_3a0._M_pi)->_M_use_count + 1;
    }
  }
  local_388._8_8_ =
       (local_328->source).state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_388._16_8_ =
       (local_328->source).state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  local_398._8_8_ = &PTR_Init_00156c18;
  local_388._0_8_ = &PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._16_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._16_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._16_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._16_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._16_8_)->_M_use_count + 1;
    }
  }
  local_360 = (undefined1  [8])((ulong)local_360 & 0xffffffff00000000);
  local_358 = (_Base_ptr)0x0;
  local_340 = (_Base_ptr)0x0;
  local_270._0_8_ = &PTR_Init_001570c8;
  local_260._vptr_IState = (_func_int **)&PTR_Init_00156c18;
  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&PTR_Init_00156bc0;
  if (local_3a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_3a0._M_pi)->_M_use_count = (local_3a0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_3a0._M_pi)->_M_use_count = (local_3a0._M_pi)->_M_use_count + 1;
    }
  }
  local_240._8_8_ = &PTR_Init_00156c18;
  local_230._0_8_ = &PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._16_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._16_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._16_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._16_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._16_8_)->_M_use_count + 1;
    }
  }
  local_350 = (_Base_ptr)local_360;
  local_348._M_node = (_Base_ptr)local_360;
  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)local_3b0._8_8_;
  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_3a0._M_pi;
  local_230._8_8_ = local_388._8_8_;
  local_230._16_8_ = local_388._16_8_;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &p_Stack_210,
             (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &iStack_368);
  local_3c8 = (undefined1  [8])&PTR_Init_001570c8;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &iStack_368);
  local_398._8_8_ = &PTR_Init_00156c18;
  local_388._0_8_ = &PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._16_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._16_8_);
  }
  local_3c0._8_8_ = &PTR_Init_00156c18;
  local_3b0._0_8_ = &PTR_Init_00156bc0;
  if (local_3a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3a0._M_pi);
  }
  local_3c8 = (undefined1  [8])&PTR_Init_001570c8;
  local_3c0._8_8_ = &PTR_Init_00156c18;
  local_3b0._0_8_ = &PTR_Init_00156bc0;
  local_3b0._8_8_ =
       local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_3a0._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)
       ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage + 8) =
           *(_Atomic_word *)
            ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)
       ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage + 8) =
           *(_Atomic_word *)
            ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 8) + 1;
    }
  }
  local_398._8_8_ = &PTR_Init_00156c18;
  local_388._0_8_ = &PTR_Init_00156bc0;
  local_388._8_8_ = local_230._8_8_;
  local_388._16_8_ = local_230._16_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230._16_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_230._16_8_ + 8) = *(_Atomic_word *)(local_230._16_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_230._16_8_ + 8) = *(_Atomic_word *)(local_230._16_8_ + 8) + 1;
    }
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &iStack_368,
             (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &p_Stack_210);
  linq::
  IEnumerableCore<linq::ExceptState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:137:13),_int>_>
  ::iterator::iterator
            ((iterator *)local_138,
             (ExceptState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:137:13),_int>
              *)local_3c8,true);
  local_3c8 = (undefined1  [8])&PTR_Init_001570c8;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &iStack_368);
  local_398._8_8_ = &PTR_Init_00156c18;
  local_388._0_8_ = &PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._16_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._16_8_);
  }
  local_3c0._8_8_ = &PTR_Init_00156c18;
  local_3b0._0_8_ = &PTR_Init_00156bc0;
  if (local_3a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3a0._M_pi);
  }
  local_3c8 = (undefined1  [8])&PTR_Init_001570c8;
  local_3c0._8_8_ = &PTR_Init_00156c18;
  local_3b0._0_8_ = &PTR_Init_00156bc0;
  local_3b0._8_8_ =
       local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_3a0._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)
       ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage + 8) =
           *(_Atomic_word *)
            ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)
       ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage + 8) =
           *(_Atomic_word *)
            ((long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 8) + 1;
    }
  }
  local_398._8_8_ = &PTR_Init_00156c18;
  local_388._0_8_ = &PTR_Init_00156bc0;
  local_388._8_8_ = local_230._8_8_;
  local_388._16_8_ = local_230._16_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230._16_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_230._16_8_ + 8) = *(_Atomic_word *)(local_230._16_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_230._16_8_ + 8) = *(_Atomic_word *)(local_230._16_8_ + 8) + 1;
    }
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &iStack_368,
             (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &p_Stack_210);
  linq::
  IEnumerableCore<linq::ExceptState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:137:13),_int>_>
  ::iterator::iterator
            ((iterator *)local_1d8,
             (ExceptState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:137:13),_int>
              *)local_3c8,false);
  local_3c8 = (undefined1  [8])&PTR_Init_001570c8;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &iStack_368);
  local_398._8_8_ = &PTR_Init_00156c18;
  local_388._0_8_ = &PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._16_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._16_8_);
  }
  local_3c0._8_8_ = &PTR_Init_00156c18;
  local_3b0._0_8_ = &PTR_Init_00156bc0;
  if (local_3a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3a0._M_pi);
  }
  uVar18 = 0;
  while( true ) {
    local_318.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_001570c8;
    local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)CONCAT71(local_1c0._17_7_,local_1c0[0x10]);
    local_318.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR_Init_00156c18;
    local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)&PTR_Init_00156bc0;
    local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)local_1c0._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage)->_M_use_count + 1;
      }
    }
    local_2e8._8_8_ = &PTR_Init_00156c18;
    local_2d8._0_8_ = &PTR_Init_00156bc0;
    local_2d8._8_8_ = local_198._8_8_;
    local_2d8._16_8_ = local_198._16_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_198._16_8_ + 8) = *(_Atomic_word *)(local_198._16_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_198._16_8_ + 8) = *(_Atomic_word *)(local_198._16_8_ + 8) + 1;
      }
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               &p_Stack_2b8,
               (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               &iStack_178);
    local_288 = local_148;
    local_3c8 = (undefined1  [8])&PTR_Init_001570c8;
    local_3c0._8_8_ = &PTR_Init_00156c18;
    local_3b0._0_8_ = &PTR_Init_00156bc0;
    local_3b0._8_8_ =
         local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    local_3a0._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)
         ((long)local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + 8) =
             *(_Atomic_word *)
              ((long)local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)
         ((long)local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + 8) =
             *(_Atomic_word *)
              ((long)local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 8) + 1;
      }
    }
    local_398._8_8_ = &PTR_Init_00156c18;
    local_388._0_8_ = &PTR_Init_00156bc0;
    local_388._8_8_ = local_2d8._8_8_;
    local_388._16_8_ = local_2d8._16_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_2d8._16_8_ + 8) = *(_Atomic_word *)(local_2d8._16_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_2d8._16_8_ + 8) = *(_Atomic_word *)(local_2d8._16_8_ + 8) + 1;
      }
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               &iStack_368,
               (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               &p_Stack_2b8);
    bVar10 = local_a8;
    bVar8 = local_288;
    local_338 = CONCAT71(local_338._1_7_,local_288);
    local_3c8 = (undefined1  [8])&PTR_Init_001570c8;
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               &iStack_368);
    local_398._8_8_ = &PTR_Init_00156c18;
    local_388._0_8_ = &PTR_Init_00156bc0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._16_8_);
    }
    local_3c0._8_8_ = &PTR_Init_00156c18;
    local_3b0._0_8_ = &PTR_Init_00156bc0;
    if (local_3a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3a0._M_pi);
    }
    local_318.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_001570c8;
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               &p_Stack_2b8);
    local_2e8._8_8_ = &PTR_Init_00156c18;
    local_2d8._0_8_ = &PTR_Init_00156bc0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._16_8_);
    }
    local_318.state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR_Init_00156c18;
    local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)&PTR_Init_00156bc0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_300.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
    }
    if (((bVar10 | bVar8) & 1) == 0) break;
    (**(code **)(*(long *)local_118._M_current + 0x18))();
    linq::
    ExceptState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:137:13),_int>
    ::Advance((ExceptState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_linq::IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:137:13),_int>
               *)local_138);
    uVar18 = uVar18 + 1;
    local_a8 = (bool)(**(code **)(*(long *)local_118._M_current + 8))();
  }
  local_1d8 = (undefined1  [8])&PTR_Init_001570c8;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &iStack_178);
  local_1a8._8_8_ = &PTR_Init_00156c18;
  local_198._0_8_ = &PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._16_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._16_8_);
  }
  local_1c8._vptr_IState = (_func_int **)&PTR_Init_00156c18;
  local_1c0._0_8_ = &PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(local_1c0._17_7_,local_1c0[0x10]) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(local_1c0._17_7_,local_1c0[0x10]));
  }
  local_138 = (undefined1  [8])&PTR_Init_001570c8;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &local_d8);
  local_100 = &PTR_Init_00156c18;
  local_f8._vptr_IState = (_func_int **)&PTR_Init_00156bc0;
  if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
  }
  local_128._vptr_IState = (_func_int **)&PTR_Init_00156c18;
  local_120._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(uStack_10f,local_110) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(uStack_10f,local_110));
  }
  assertEquals<int,unsigned_long>(0,uVar18);
  local_270._0_8_ = &PTR_Init_001570c8;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &p_Stack_210);
  local_240._8_8_ = &PTR_Init_00156c18;
  local_230._0_8_ = &PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230._16_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230._16_8_);
  }
  local_260._vptr_IState = (_func_int **)&PTR_Init_00156c18;
  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  }
  pWVar7 = local_328;
  linq::
  WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>
  ::Init(local_328);
  iVar12 = (*((pWVar7->source).state.
              super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             _vptr_IState[1])();
  assertEquals<bool,bool>(true,SUB41(iVar12,0));
  local_3b0._0_8_ =
       (pWVar7->source).state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_3b0._8_8_ =
       (pWVar7->source).state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_ ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_3c8 = (undefined1  [8])&PTR_Init_00157110;
    local_3c0._0_8_ = &PTR_Init_00156c18;
    local_3c0._8_8_ = &PTR_Init_00156bc0;
    local_3b0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_)->_M_use_count + 1;
      UNLOCK();
      if (__libc_single_threaded != '\0') {
        _Var17 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_)->_M_use_count;
        goto LAB_0010c538;
      }
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      _Var17 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_)->_M_use_count + 1;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_)->_M_use_count = _Var17;
LAB_0010c538:
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_)->_M_use_count = _Var17 + 1;
    }
    local_3c0._8_8_ = &PTR_Init_00156bc0;
    local_3c0._0_8_ = &PTR_Init_00156c18;
    local_3c8 = (undefined1  [8])&PTR_Init_00157110;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_);
  }
  linq::
  WhereState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:36:33),_int>
  ::Init((WhereState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:36:33),_int>
          *)local_3c8);
  iVar12 = (*(*(_func_int ***)local_3b0._0_8_)[1])();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_);
  }
  assertEquals<bool,bool>(true,SUB41(iVar12,0));
  pWVar7 = local_328;
  linq::
  WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>
  ::Init(local_328);
  iVar12 = (*((pWVar7->source).state.
              super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             _vptr_IState[1])();
  bVar10 = true;
  while ((char)iVar12 != '\0') {
    iVar12 = (*((pWVar7->source).state.
                super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               _vptr_IState[3])();
    bVar10 = 9 < iVar12;
    if (iVar12 < 10) break;
    linq::
    WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>
    ::Advance(pWVar7);
    iVar12 = (*((pWVar7->source).state.
                super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               _vptr_IState[1])();
  }
  assertEquals<bool,bool>(false,bVar10);
  local_3b0._0_8_ =
       (pWVar7->source).state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_3b0._8_8_ =
       (pWVar7->source).state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_ ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_3c8 = (undefined1  [8])&PTR_Init_00157158;
    local_3c0._0_8_ = &PTR_Init_00156c18;
    local_3c0._8_8_ = &PTR_Init_00156bc0;
    local_3b0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    goto LAB_0010c68d;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_)->_M_use_count =
         ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_)->_M_use_count + 1;
    UNLOCK();
    if (__libc_single_threaded != '\0') {
      _Var17 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_)->_M_use_count;
      goto LAB_0010c683;
    }
    LOCK();
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_)->_M_use_count =
         ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_)->_M_use_count + 1;
    UNLOCK();
  }
  else {
    _Var17 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_)->_M_use_count + 1;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_)->_M_use_count = _Var17;
LAB_0010c683:
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_)->_M_use_count = _Var17 + 1;
  }
  local_3c0._8_8_ = &PTR_Init_00156bc0;
  local_3c0._0_8_ = &PTR_Init_00156c18;
  local_3c8 = (undefined1  [8])&PTR_Init_00157158;
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_);
LAB_0010c68d:
  linq::
  WhereState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:38:33),_int>
  ::Init((WhereState<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:38:33),_int>
          *)local_3c8);
  iVar12 = (*(*(_func_int ***)local_3b0._0_8_)[1])();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_);
  }
  assertEquals<bool,bool>(false,SUB41(iVar12,0));
  pWVar7 = local_328;
  linq::
  WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>
  ::Init(local_328);
  iVar12 = (*((pWVar7->source).state.
              super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             _vptr_IState[1])();
  bVar10 = true;
  while ((char)iVar12 != '\0') {
    iVar12 = (*((pWVar7->source).state.
                super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               _vptr_IState[3])();
    bVar10 = iVar12 < 0xb;
    if (10 < iVar12) break;
    linq::
    WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>
    ::Advance(pWVar7);
    iVar12 = (*((pWVar7->source).state.
                super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               _vptr_IState[1])();
  }
  assertEquals<bool,bool>(true,bVar10);
  local_3c8._0_4_ = 6;
  bVar10 = linq::
           IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>
           ::Contains<int>((IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>
                            *)pWVar7,(int *)local_3c8);
  assertEquals<bool,bool>(true,bVar10);
  local_3c8._0_4_ = 0x10;
  bVar10 = linq::
           IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>
           ::Contains<int>((IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>
                            *)pWVar7,(int *)local_3c8);
  assertEquals<bool,bool>(false,bVar10);
  return;
}

Assistant:

void test(S source)
{
	assertEquals(    3, source.Min());
	assertEquals(   10, source.Max());
	assertEquals(    8, source.Count());
	assertEquals(   52, source.Sum());
	assertEquals(    3, source.Take(3).Min());
	assertEquals(    5, source.Take(3).Max());
	assertEquals(    6, source.Skip(3).Min());
	assertEquals(   10, source.Skip(3).Max());
	assertEquals(    3, source.TakeWhile([](int x){ return x < 5; }).Min());
	assertEquals(    4, source.TakeWhile([](int x){ return x < 5; }).Max());
	assertEquals(    5, source.SkipWhile([](int x){ return x < 5; }).Min());
	assertEquals(    4, source.Where([](int x){ return x < 7; }).Count());
	assertEquals(    6, source.Where([](int x){ return x % 3 == 0; }).Skip(1).First());
	assertEquals(    2, source.GroupBy([](int x){ return x < 5; }).Count());
	assertEquals(    6, source.GroupBy([](int x){ return x < 5; }).First().Count());
	assertEquals(    2, source.GroupBy([](int x){ return x < 5; }).Last().Count());
	assertEquals(    5, source.Single([](int x){ return x == 5; }));
	assertEquals(    5, Adapt(std::vector<int>{1,5,6,7,5}).Intersect(source).Min());
	assertEquals(    7, Adapt(std::vector<int>{1,5,6,7,5}).Intersect(source).Max());
	assertEquals(    3, Adapt(std::vector<int>{1,5,6,7,5}).Intersect(source).Count());
	assertEquals(    3, source.Intersect(Adapt(std::vector<int>{1,5,6,7,5})).Count());
	assertEquals(    5, source.Except(Adapt(std::vector<int>{1,5,6,7,5})).Count());
	assertEquals(    3, source.Except(IEnumerable<int>::Range(5,9)).Count());
	assertEquals(    8, source.Intersect(source).Count());
	assertEquals(    0, source.Except(source).Count());
	assertEquals( true, source.Any());
	assertEquals( true, source.All());
	assertEquals( true, source.Any([](int x) { return x > 9; }));
	assertEquals(false, source.All([](int x) { return x > 9; }));
	assertEquals(false, source.Any([](int x) { return x > 10; }));
	assertEquals( true, source.All([](int x) { return x <= 10; }));
	assertEquals( true, source.Contains(6));
	assertEquals(false, source.Contains(16));
}